

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx2::CurveNiIntersector1<4>::
     intersect_n<embree::avx2::OrientedCurve1Intersector1<embree::CatmullRomCurveT,7,8>,embree::avx2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  int iVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  uint uVar50;
  ulong uVar51;
  long lVar52;
  byte bVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  ulong uVar57;
  ulong uVar58;
  float fVar59;
  undefined4 uVar60;
  float fVar61;
  float fVar90;
  float fVar92;
  vint4 bi_2;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar91;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined8 uVar93;
  vint4 bi_1;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar122;
  vint4 ai_2;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  vint4 ai;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [64];
  float fVar146;
  float fVar147;
  float fVar166;
  float fVar167;
  vint4 bi;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar168;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [64];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [64];
  float fVar183;
  float fVar196;
  float fVar197;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  float fVar198;
  undefined1 auVar194 [32];
  undefined1 auVar195 [64];
  vint4 ai_1;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [64];
  float fVar222;
  vfloat4 a0_3;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [64];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [64];
  vfloat4 a0_1;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [64];
  float fVar245;
  float fVar256;
  float fVar257;
  vfloat4 a0;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar246 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  float fVar258;
  undefined1 auVar255 [64];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [32];
  undefined1 auVar266 [64];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar279 [32];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p03;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_50c;
  undefined1 local_508 [16];
  undefined1 local_4f8 [8];
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 uStack_4e0;
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [16];
  ulong local_490;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [32];
  undefined1 local_388 [16];
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  RTCFilterFunctionNArguments local_368;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 auStack_328 [16];
  undefined1 local_318 [32];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  uint auStack_2c8 [4];
  undefined8 local_2b8;
  float local_2b0;
  undefined8 local_2ac;
  uint local_2a4;
  uint local_2a0;
  uint local_29c;
  uint local_298;
  undefined1 local_288 [16];
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [32];
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  uint uStack_198;
  float afStack_194 [7];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  undefined4 uStack_fc;
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  undefined1 auVar278 [32];
  
  PVar4 = prim[1];
  uVar57 = (ulong)(byte)PVar4;
  fVar59 = *(float *)(prim + uVar57 * 0x19 + 0x12);
  auVar13 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar57 * 0x19 + 6));
  auVar62._0_4_ = fVar59 * auVar13._0_4_;
  auVar62._4_4_ = fVar59 * auVar13._4_4_;
  auVar62._8_4_ = fVar59 * auVar13._8_4_;
  auVar62._12_4_ = fVar59 * auVar13._12_4_;
  auVar148._0_4_ = fVar59 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar148._4_4_ = fVar59 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar148._8_4_ = fVar59 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar148._12_4_ = fVar59 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 4 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 5 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar129 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 6 + 6)));
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 0xb + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar248 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar4 * 0xc + uVar57 + 6)));
  auVar248 = vcvtdq2ps_avx(auVar248);
  uVar51 = (ulong)(uint)((int)(uVar57 * 9) * 2);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar51 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar51 + uVar57 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  uVar51 = (ulong)(uint)((int)(uVar57 * 5) << 2);
  auVar239 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar51 + 6)));
  auVar239 = vcvtdq2ps_avx(auVar239);
  auVar267._4_4_ = auVar148._0_4_;
  auVar267._0_4_ = auVar148._0_4_;
  auVar267._8_4_ = auVar148._0_4_;
  auVar267._12_4_ = auVar148._0_4_;
  auVar95 = vshufps_avx(auVar148,auVar148,0x55);
  auVar63 = vshufps_avx(auVar148,auVar148,0xaa);
  fVar59 = auVar63._0_4_;
  auVar236._0_4_ = fVar59 * auVar129._0_4_;
  fVar90 = auVar63._4_4_;
  auVar236._4_4_ = fVar90 * auVar129._4_4_;
  fVar122 = auVar63._8_4_;
  auVar236._8_4_ = fVar122 * auVar129._8_4_;
  fVar91 = auVar63._12_4_;
  auVar236._12_4_ = fVar91 * auVar129._12_4_;
  auVar223._0_4_ = auVar248._0_4_ * fVar59;
  auVar223._4_4_ = auVar248._4_4_ * fVar90;
  auVar223._8_4_ = auVar248._8_4_ * fVar122;
  auVar223._12_4_ = auVar248._12_4_ * fVar91;
  auVar199._0_4_ = auVar239._0_4_ * fVar59;
  auVar199._4_4_ = auVar239._4_4_ * fVar90;
  auVar199._8_4_ = auVar239._8_4_ * fVar122;
  auVar199._12_4_ = auVar239._12_4_ * fVar91;
  auVar63 = vfmadd231ps_fma(auVar236,auVar95,auVar10);
  auVar126 = vfmadd231ps_fma(auVar223,auVar95,auVar12);
  auVar95 = vfmadd231ps_fma(auVar199,auVar64,auVar95);
  auVar123 = vfmadd231ps_fma(auVar63,auVar267,auVar13);
  auVar126 = vfmadd231ps_fma(auVar126,auVar267,auVar11);
  auVar136 = vfmadd231ps_fma(auVar95,auVar65,auVar267);
  auVar268._4_4_ = auVar62._0_4_;
  auVar268._0_4_ = auVar62._0_4_;
  auVar268._8_4_ = auVar62._0_4_;
  auVar268._12_4_ = auVar62._0_4_;
  auVar95 = vshufps_avx(auVar62,auVar62,0x55);
  auVar63 = vshufps_avx(auVar62,auVar62,0xaa);
  fVar59 = auVar63._0_4_;
  auVar149._0_4_ = fVar59 * auVar129._0_4_;
  fVar90 = auVar63._4_4_;
  auVar149._4_4_ = fVar90 * auVar129._4_4_;
  fVar122 = auVar63._8_4_;
  auVar149._8_4_ = fVar122 * auVar129._8_4_;
  fVar91 = auVar63._12_4_;
  auVar149._12_4_ = fVar91 * auVar129._12_4_;
  auVar94._0_4_ = auVar248._0_4_ * fVar59;
  auVar94._4_4_ = auVar248._4_4_ * fVar90;
  auVar94._8_4_ = auVar248._8_4_ * fVar122;
  auVar94._12_4_ = auVar248._12_4_ * fVar91;
  auVar63._0_4_ = auVar239._0_4_ * fVar59;
  auVar63._4_4_ = auVar239._4_4_ * fVar90;
  auVar63._8_4_ = auVar239._8_4_ * fVar122;
  auVar63._12_4_ = auVar239._12_4_ * fVar91;
  auVar10 = vfmadd231ps_fma(auVar149,auVar95,auVar10);
  auVar129 = vfmadd231ps_fma(auVar94,auVar95,auVar12);
  auVar12 = vfmadd231ps_fma(auVar63,auVar95,auVar64);
  auVar248 = vfmadd231ps_fma(auVar10,auVar268,auVar13);
  auVar64 = vfmadd231ps_fma(auVar129,auVar268,auVar11);
  auVar239 = vfmadd231ps_fma(auVar12,auVar268,auVar65);
  local_2f8._8_4_ = 0x7fffffff;
  local_2f8._0_8_ = 0x7fffffff7fffffff;
  local_2f8._12_4_ = 0x7fffffff;
  auVar13 = vandps_avx(auVar123,local_2f8);
  auVar135._8_4_ = 0x219392ef;
  auVar135._0_8_ = 0x219392ef219392ef;
  auVar135._12_4_ = 0x219392ef;
  auVar13 = vcmpps_avx(auVar13,auVar135,1);
  auVar10 = vblendvps_avx(auVar123,auVar135,auVar13);
  auVar13 = vandps_avx(auVar126,local_2f8);
  auVar13 = vcmpps_avx(auVar13,auVar135,1);
  auVar129 = vblendvps_avx(auVar126,auVar135,auVar13);
  auVar13 = vandps_avx(auVar136,local_2f8);
  auVar13 = vcmpps_avx(auVar13,auVar135,1);
  auVar13 = vblendvps_avx(auVar136,auVar135,auVar13);
  auVar11 = vrcpps_avx(auVar10);
  auVar184._8_4_ = 0x3f800000;
  auVar184._0_8_ = 0x3f8000003f800000;
  auVar184._12_4_ = 0x3f800000;
  auVar10 = vfnmadd213ps_fma(auVar10,auVar11,auVar184);
  auVar11 = vfmadd132ps_fma(auVar10,auVar11,auVar11);
  auVar10 = vrcpps_avx(auVar129);
  auVar129 = vfnmadd213ps_fma(auVar129,auVar10,auVar184);
  auVar12 = vfmadd132ps_fma(auVar129,auVar10,auVar10);
  auVar10 = vrcpps_avx(auVar13);
  auVar13 = vfnmadd213ps_fma(auVar13,auVar10,auVar184);
  auVar65 = vfmadd132ps_fma(auVar13,auVar10,auVar10);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar57 * 7 + 6);
  auVar13 = vpmovsxwd_avx(auVar13);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar248);
  auVar136._0_4_ = auVar11._0_4_ * auVar13._0_4_;
  auVar136._4_4_ = auVar11._4_4_ * auVar13._4_4_;
  auVar136._8_4_ = auVar11._8_4_ * auVar13._8_4_;
  auVar136._12_4_ = auVar11._12_4_ * auVar13._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar57 * 9 + 6);
  auVar13 = vpmovsxwd_avx(auVar10);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar248);
  auVar150._0_4_ = auVar11._0_4_ * auVar13._0_4_;
  auVar150._4_4_ = auVar11._4_4_ * auVar13._4_4_;
  auVar150._8_4_ = auVar11._8_4_ * auVar13._8_4_;
  auVar150._12_4_ = auVar11._12_4_ * auVar13._12_4_;
  auVar126._1_3_ = 0;
  auVar126[0] = PVar4;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar10 = vpmovsxwd_avx(auVar129);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar57 * -2 + 6);
  auVar13 = vpmovsxwd_avx(auVar11);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar64);
  auVar200._0_4_ = auVar13._0_4_ * auVar12._0_4_;
  auVar200._4_4_ = auVar13._4_4_ * auVar12._4_4_;
  auVar200._8_4_ = auVar13._8_4_ * auVar12._8_4_;
  auVar200._12_4_ = auVar13._12_4_ * auVar12._12_4_;
  auVar13 = vcvtdq2ps_avx(auVar10);
  auVar13 = vsubps_avx(auVar13,auVar64);
  auVar95._0_4_ = auVar12._0_4_ * auVar13._0_4_;
  auVar95._4_4_ = auVar12._4_4_ * auVar13._4_4_;
  auVar95._8_4_ = auVar12._8_4_ * auVar13._8_4_;
  auVar95._12_4_ = auVar12._12_4_ * auVar13._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar51 + uVar57 + 6);
  auVar13 = vpmovsxwd_avx(auVar12);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar239);
  auVar123._0_4_ = auVar65._0_4_ * auVar13._0_4_;
  auVar123._4_4_ = auVar65._4_4_ * auVar13._4_4_;
  auVar123._8_4_ = auVar65._8_4_ * auVar13._8_4_;
  auVar123._12_4_ = auVar65._12_4_ * auVar13._12_4_;
  auVar248._8_8_ = 0;
  auVar248._0_8_ = *(ulong *)(prim + uVar57 * 0x17 + 6);
  auVar13 = vpmovsxwd_avx(auVar248);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar13 = vsubps_avx(auVar13,auVar239);
  auVar64._0_4_ = auVar65._0_4_ * auVar13._0_4_;
  auVar64._4_4_ = auVar65._4_4_ * auVar13._4_4_;
  auVar64._8_4_ = auVar65._8_4_ * auVar13._8_4_;
  auVar64._12_4_ = auVar65._12_4_ * auVar13._12_4_;
  auVar13 = vpminsd_avx(auVar136,auVar150);
  auVar10 = vpminsd_avx(auVar200,auVar95);
  auVar13 = vmaxps_avx(auVar13,auVar10);
  auVar10 = vpminsd_avx(auVar123,auVar64);
  uVar60 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar210._4_4_ = uVar60;
  auVar210._0_4_ = uVar60;
  auVar210._8_4_ = uVar60;
  auVar210._12_4_ = uVar60;
  auVar10 = vmaxps_avx(auVar10,auVar210);
  auVar13 = vmaxps_avx(auVar13,auVar10);
  local_288._0_4_ = auVar13._0_4_ * 0.99999964;
  local_288._4_4_ = auVar13._4_4_ * 0.99999964;
  local_288._8_4_ = auVar13._8_4_ * 0.99999964;
  local_288._12_4_ = auVar13._12_4_ * 0.99999964;
  auVar13 = vpmaxsd_avx(auVar136,auVar150);
  auVar10 = vpmaxsd_avx(auVar200,auVar95);
  auVar13 = vminps_avx(auVar13,auVar10);
  auVar10 = vpmaxsd_avx(auVar123,auVar64);
  fVar59 = (ray->super_RayK<1>).tfar;
  auVar239._4_4_ = fVar59;
  auVar239._0_4_ = fVar59;
  auVar239._8_4_ = fVar59;
  auVar239._12_4_ = fVar59;
  auVar10 = vminps_avx(auVar10,auVar239);
  auVar13 = vminps_avx(auVar13,auVar10);
  auVar65._0_4_ = auVar13._0_4_ * 1.0000004;
  auVar65._4_4_ = auVar13._4_4_ * 1.0000004;
  auVar65._8_4_ = auVar13._8_4_ * 1.0000004;
  auVar65._12_4_ = auVar13._12_4_ * 1.0000004;
  auVar126[4] = PVar4;
  auVar126._5_3_ = 0;
  auVar126[8] = PVar4;
  auVar126._9_3_ = 0;
  auVar126[0xc] = PVar4;
  auVar126._13_3_ = 0;
  auVar10 = vpcmpgtd_avx(auVar126,_DAT_01f7fcf0);
  auVar13 = vcmpps_avx(local_288,auVar65,2);
  auVar13 = vandps_avx(auVar13,auVar10);
  uVar50 = vmovmskps_avx(auVar13);
  if (uVar50 == 0) {
    return;
  }
  uVar50 = uVar50 & 0xff;
  auVar87._16_16_ = mm_lookupmask_ps._240_16_;
  auVar87._0_16_ = mm_lookupmask_ps._240_16_;
  local_178 = vblendps_avx(auVar87,ZEXT832(0) << 0x20,0x80);
  do {
    lVar52 = 0;
    uVar57 = (ulong)uVar50;
    for (uVar51 = uVar57; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000) {
      lVar52 = lVar52 + 1;
    }
    uVar50 = *(uint *)(prim + 2);
    pGVar5 = (context->scene->geometries).items[uVar50].ptr;
    local_490 = (ulong)*(uint *)(prim + lVar52 * 4 + 6);
    uVar51 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                             pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i * (ulong)*(uint *)(prim + lVar52 * 4 + 6));
    p_Var6 = pGVar5[1].intersectionFilterN;
    pvVar7 = pGVar5[2].userPtr;
    _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar13 = *(undefined1 (*) [16])(_Var8 + uVar51 * (long)pvVar7);
    auVar10 = *(undefined1 (*) [16])(_Var8 + (uVar51 + 1) * (long)pvVar7);
    auVar129 = *(undefined1 (*) [16])(_Var8 + (uVar51 + 2) * (long)pvVar7);
    pfVar1 = (float *)(_Var8 + (long)pvVar7 * (uVar51 + 3));
    fVar59 = *pfVar1;
    fVar90 = pfVar1[1];
    fVar122 = pfVar1[2];
    fVar91 = pfVar1[3];
    lVar52 = *(long *)&pGVar5[1].time_range.upper;
    auVar11 = *(undefined1 (*) [16])(lVar52 + (long)p_Var6 * uVar51);
    auVar12 = *(undefined1 (*) [16])(lVar52 + (long)p_Var6 * (uVar51 + 1));
    auVar248 = *(undefined1 (*) [16])(lVar52 + (long)p_Var6 * (uVar51 + 2));
    uVar57 = uVar57 - 1 & uVar57;
    pfVar1 = (float *)(lVar52 + (long)p_Var6 * (uVar51 + 3));
    fVar92 = *pfVar1;
    fVar61 = pfVar1[1];
    fVar147 = pfVar1[2];
    fVar222 = pfVar1[3];
    if (uVar57 != 0) {
      uVar58 = uVar57 - 1 & uVar57;
      for (uVar51 = uVar57; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000) {
      }
      if (uVar58 != 0) {
        for (; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
        }
      }
    }
    auVar96._8_4_ = 0x80000000;
    auVar96._0_8_ = 0x8000000080000000;
    auVar96._12_4_ = 0x80000000;
    auVar111._0_4_ = fVar92 * -0.0;
    auVar111._4_4_ = fVar61 * -0.0;
    auVar111._8_4_ = fVar147 * -0.0;
    auVar111._12_4_ = fVar222 * -0.0;
    auVar65 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar248,auVar111);
    auVar66._0_4_ = auVar12._0_4_ + auVar65._0_4_;
    auVar66._4_4_ = auVar12._4_4_ + auVar65._4_4_;
    auVar66._8_4_ = auVar12._8_4_ + auVar65._8_4_;
    auVar66._12_4_ = auVar12._12_4_ + auVar65._12_4_;
    auVar64 = vfmadd231ps_fma(auVar66,auVar11,auVar96);
    auVar123 = ZEXT816(0) << 0x40;
    auVar97._0_4_ = fVar92 * 0.0;
    auVar97._4_4_ = fVar61 * 0.0;
    auVar97._8_4_ = fVar147 * 0.0;
    auVar97._12_4_ = fVar222 * 0.0;
    auVar274._8_4_ = 0x3f000000;
    auVar274._0_8_ = 0x3f0000003f000000;
    auVar274._12_4_ = 0x3f000000;
    auVar65 = vfmadd231ps_fma(auVar97,auVar248,auVar274);
    auVar65 = vfmadd231ps_fma(auVar65,auVar12,auVar123);
    auVar63 = vfnmadd231ps_fma(auVar65,auVar11,auVar274);
    auVar259._0_4_ = fVar59 * -0.0;
    auVar259._4_4_ = fVar90 * -0.0;
    auVar259._8_4_ = fVar122 * -0.0;
    auVar259._12_4_ = fVar91 * -0.0;
    auVar65 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar129,auVar259);
    auVar246._0_4_ = auVar65._0_4_ + auVar10._0_4_;
    auVar246._4_4_ = auVar65._4_4_ + auVar10._4_4_;
    auVar246._8_4_ = auVar65._8_4_ + auVar10._8_4_;
    auVar246._12_4_ = auVar65._12_4_ + auVar10._12_4_;
    auVar65 = vfmadd231ps_fma(auVar246,auVar13,auVar96);
    auVar237._0_4_ = fVar59 * 0.0;
    auVar237._4_4_ = fVar90 * 0.0;
    auVar237._8_4_ = fVar122 * 0.0;
    auVar237._12_4_ = fVar91 * 0.0;
    auVar239 = vfmadd231ps_fma(auVar237,auVar129,auVar274);
    auVar239 = vfmadd231ps_fma(auVar239,auVar10,auVar123);
    auVar126 = vfnmadd231ps_fma(auVar239,auVar13,auVar274);
    auVar112._0_4_ = auVar248._0_4_ + auVar111._0_4_;
    auVar112._4_4_ = auVar248._4_4_ + auVar111._4_4_;
    auVar112._8_4_ = auVar248._8_4_ + auVar111._8_4_;
    auVar112._12_4_ = auVar248._12_4_ + auVar111._12_4_;
    auVar239 = vfmadd231ps_fma(auVar112,auVar12,auVar123);
    auVar239 = vfmadd231ps_fma(auVar239,auVar11,auVar96);
    auVar124._0_4_ = fVar92 * 0.5;
    auVar124._4_4_ = fVar61 * 0.5;
    auVar124._8_4_ = fVar147 * 0.5;
    auVar124._12_4_ = fVar222 * 0.5;
    auVar248 = vfmadd231ps_fma(auVar124,auVar123,auVar248);
    auVar12 = vfnmadd231ps_fma(auVar248,auVar274,auVar12);
    auVar95 = vfmadd231ps_fma(auVar12,auVar123,auVar11);
    auVar201._0_4_ = auVar259._0_4_ + auVar129._0_4_;
    auVar201._4_4_ = auVar259._4_4_ + auVar129._4_4_;
    auVar201._8_4_ = auVar259._8_4_ + auVar129._8_4_;
    auVar201._12_4_ = auVar259._12_4_ + auVar129._12_4_;
    auVar11 = vfmadd231ps_fma(auVar201,auVar10,auVar123);
    auVar12 = vfmadd231ps_fma(auVar11,auVar13,auVar96);
    auVar211._0_4_ = fVar59 * 0.5;
    auVar211._4_4_ = fVar90 * 0.5;
    auVar211._8_4_ = fVar122 * 0.5;
    auVar211._12_4_ = fVar91 * 0.5;
    auVar129 = vfmadd231ps_fma(auVar211,auVar123,auVar129);
    auVar10 = vfnmadd231ps_fma(auVar129,auVar274,auVar10);
    auVar248 = vfmadd231ps_fma(auVar10,auVar123,auVar13);
    auVar13 = vshufps_avx(auVar63,auVar63,0xc9);
    auVar10 = vshufps_avx(auVar65,auVar65,0xc9);
    fVar92 = auVar63._0_4_;
    auVar151._0_4_ = fVar92 * auVar10._0_4_;
    fVar61 = auVar63._4_4_;
    auVar151._4_4_ = fVar61 * auVar10._4_4_;
    fVar147 = auVar63._8_4_;
    auVar151._8_4_ = fVar147 * auVar10._8_4_;
    fVar222 = auVar63._12_4_;
    auVar151._12_4_ = fVar222 * auVar10._12_4_;
    auVar10 = vfmsub231ps_fma(auVar151,auVar13,auVar65);
    auVar129 = vshufps_avx(auVar10,auVar10,0xc9);
    auVar10 = vshufps_avx(auVar126,auVar126,0xc9);
    auVar152._0_4_ = fVar92 * auVar10._0_4_;
    auVar152._4_4_ = fVar61 * auVar10._4_4_;
    auVar152._8_4_ = fVar147 * auVar10._8_4_;
    auVar152._12_4_ = fVar222 * auVar10._12_4_;
    auVar13 = vfmsub231ps_fma(auVar152,auVar13,auVar126);
    auVar11 = vshufps_avx(auVar13,auVar13,0xc9);
    auVar13 = vshufps_avx(auVar95,auVar95,0xc9);
    auVar10 = vshufps_avx(auVar12,auVar12,0xc9);
    fVar183 = auVar95._0_4_;
    auVar137._0_4_ = fVar183 * auVar10._0_4_;
    fVar196 = auVar95._4_4_;
    auVar137._4_4_ = fVar196 * auVar10._4_4_;
    fVar197 = auVar95._8_4_;
    auVar137._8_4_ = fVar197 * auVar10._8_4_;
    fVar198 = auVar95._12_4_;
    auVar137._12_4_ = fVar198 * auVar10._12_4_;
    auVar10 = vfmsub231ps_fma(auVar137,auVar13,auVar12);
    auVar12 = vshufps_avx(auVar10,auVar10,0xc9);
    auVar10 = vshufps_avx(auVar248,auVar248,0xc9);
    auVar169._0_4_ = fVar183 * auVar10._0_4_;
    auVar169._4_4_ = fVar196 * auVar10._4_4_;
    auVar169._8_4_ = fVar197 * auVar10._8_4_;
    auVar169._12_4_ = fVar198 * auVar10._12_4_;
    auVar10 = vfmsub231ps_fma(auVar169,auVar13,auVar248);
    auVar13 = vdpps_avx(auVar129,auVar129,0x7f);
    auVar248 = vshufps_avx(auVar10,auVar10,0xc9);
    fVar90 = auVar13._0_4_;
    auVar212._4_12_ = ZEXT812(0) << 0x20;
    auVar212._0_4_ = fVar90;
    auVar10 = vrsqrtss_avx(auVar212,auVar212);
    fVar59 = auVar10._0_4_;
    auVar10 = vdpps_avx(auVar129,auVar11,0x7f);
    fVar59 = fVar59 * 1.5 + fVar90 * -0.5 * fVar59 * fVar59 * fVar59;
    fVar146 = fVar59 * auVar129._0_4_;
    fVar166 = fVar59 * auVar129._4_4_;
    fVar167 = fVar59 * auVar129._8_4_;
    fVar168 = fVar59 * auVar129._12_4_;
    auVar224._0_4_ = auVar11._0_4_ * fVar90;
    auVar224._4_4_ = auVar11._4_4_ * fVar90;
    auVar224._8_4_ = auVar11._8_4_ * fVar90;
    auVar224._12_4_ = auVar11._12_4_ * fVar90;
    fVar90 = auVar10._0_4_;
    auVar185._0_4_ = fVar90 * auVar129._0_4_;
    auVar185._4_4_ = fVar90 * auVar129._4_4_;
    auVar185._8_4_ = fVar90 * auVar129._8_4_;
    auVar185._12_4_ = fVar90 * auVar129._12_4_;
    auVar129 = vsubps_avx(auVar224,auVar185);
    auVar10 = vrcpss_avx(auVar212,auVar212);
    auVar13 = vfnmadd213ss_fma(auVar13,auVar10,SUB6416(ZEXT464(0x40000000),0));
    fVar122 = auVar10._0_4_ * auVar13._0_4_;
    auVar13 = vdpps_avx(auVar12,auVar12,0x7f);
    fVar91 = auVar13._0_4_;
    auVar202._4_12_ = ZEXT812(0) << 0x20;
    auVar202._0_4_ = fVar91;
    auVar10 = vrsqrtss_avx(auVar202,auVar202);
    fVar90 = auVar10._0_4_;
    fVar90 = fVar90 * 1.5 + fVar91 * -0.5 * fVar90 * fVar90 * fVar90;
    fVar245 = fVar90 * auVar12._0_4_;
    fVar256 = fVar90 * auVar12._4_4_;
    fVar257 = fVar90 * auVar12._8_4_;
    fVar258 = fVar90 * auVar12._12_4_;
    auVar10 = vdpps_avx(auVar12,auVar248,0x7f);
    auVar170._0_4_ = fVar91 * auVar248._0_4_;
    auVar170._4_4_ = fVar91 * auVar248._4_4_;
    auVar170._8_4_ = fVar91 * auVar248._8_4_;
    auVar170._12_4_ = fVar91 * auVar248._12_4_;
    fVar91 = auVar10._0_4_;
    auVar138._0_4_ = fVar91 * auVar12._0_4_;
    auVar138._4_4_ = fVar91 * auVar12._4_4_;
    auVar138._8_4_ = fVar91 * auVar12._8_4_;
    auVar138._12_4_ = fVar91 * auVar12._12_4_;
    auVar11 = vsubps_avx(auVar170,auVar138);
    auVar10 = vrcpss_avx(auVar202,auVar202);
    auVar13 = vfnmadd213ss_fma(auVar13,auVar10,SUB6416(ZEXT464(0x40000000),0));
    fVar91 = auVar13._0_4_ * auVar10._0_4_;
    auVar13 = vshufps_avx(auVar64,auVar64,0xff);
    auVar203._0_4_ = auVar13._0_4_ * fVar146;
    auVar203._4_4_ = auVar13._4_4_ * fVar166;
    auVar203._8_4_ = auVar13._8_4_ * fVar167;
    auVar203._12_4_ = auVar13._12_4_ * fVar168;
    local_3f8 = vsubps_avx(auVar64,auVar203);
    auVar10 = vshufps_avx(auVar63,auVar63,0xff);
    auVar153._0_4_ = auVar10._0_4_ * fVar146 + auVar13._0_4_ * fVar59 * fVar122 * auVar129._0_4_;
    auVar153._4_4_ = auVar10._4_4_ * fVar166 + auVar13._4_4_ * fVar59 * fVar122 * auVar129._4_4_;
    auVar153._8_4_ = auVar10._8_4_ * fVar167 + auVar13._8_4_ * fVar59 * fVar122 * auVar129._8_4_;
    auVar153._12_4_ = auVar10._12_4_ * fVar168 + auVar13._12_4_ * fVar59 * fVar122 * auVar129._12_4_
    ;
    auVar129 = vsubps_avx(auVar63,auVar153);
    local_408._0_4_ = auVar203._0_4_ + auVar64._0_4_;
    local_408._4_4_ = auVar203._4_4_ + auVar64._4_4_;
    fStack_400 = auVar203._8_4_ + auVar64._8_4_;
    fStack_3fc = auVar203._12_4_ + auVar64._12_4_;
    auVar13 = vshufps_avx(auVar239,auVar239,0xff);
    auVar98._0_4_ = fVar245 * auVar13._0_4_;
    auVar98._4_4_ = fVar256 * auVar13._4_4_;
    auVar98._8_4_ = fVar257 * auVar13._8_4_;
    auVar98._12_4_ = fVar258 * auVar13._12_4_;
    local_418 = vsubps_avx(auVar239,auVar98);
    auVar10 = vshufps_avx(auVar95,auVar95,0xff);
    auVar67._0_4_ = fVar245 * auVar10._0_4_ + auVar13._0_4_ * fVar90 * auVar11._0_4_ * fVar91;
    auVar67._4_4_ = fVar256 * auVar10._4_4_ + auVar13._4_4_ * fVar90 * auVar11._4_4_ * fVar91;
    auVar67._8_4_ = fVar257 * auVar10._8_4_ + auVar13._8_4_ * fVar90 * auVar11._8_4_ * fVar91;
    auVar67._12_4_ = fVar258 * auVar10._12_4_ + auVar13._12_4_ * fVar90 * auVar11._12_4_ * fVar91;
    auVar13 = vsubps_avx(auVar95,auVar67);
    local_488 = auVar239._0_4_ + auVar98._0_4_;
    fStack_484 = auVar239._4_4_ + auVar98._4_4_;
    fStack_480 = auVar239._8_4_ + auVar98._8_4_;
    fStack_47c = auVar239._12_4_ + auVar98._12_4_;
    local_428._0_4_ = local_3f8._0_4_ + auVar129._0_4_ * 0.33333334;
    local_428._4_4_ = local_3f8._4_4_ + auVar129._4_4_ * 0.33333334;
    local_428._8_4_ = local_3f8._8_4_ + auVar129._8_4_ * 0.33333334;
    local_428._12_4_ = local_3f8._12_4_ + auVar129._12_4_ * 0.33333334;
    auVar68._0_4_ = auVar13._0_4_ * 0.33333334;
    auVar68._4_4_ = auVar13._4_4_ * 0.33333334;
    auVar68._8_4_ = auVar13._8_4_ * 0.33333334;
    auVar68._12_4_ = auVar13._12_4_ * 0.33333334;
    local_438 = vsubps_avx(local_418,auVar68);
    aVar2 = (ray->super_RayK<1>).org.field_0;
    auVar129 = vsubps_avx(local_3f8,(undefined1  [16])aVar2);
    auVar13 = vshufps_avx(auVar129,auVar129,0x55);
    auVar10 = vshufps_avx(auVar129,auVar129,0xaa);
    aVar3 = (pre->ray_space).vy.field_0;
    fVar59 = (pre->ray_space).vz.field_0.m128[0];
    fVar90 = (pre->ray_space).vz.field_0.m128[1];
    fVar122 = (pre->ray_space).vz.field_0.m128[2];
    fVar91 = (pre->ray_space).vz.field_0.m128[3];
    auVar69._0_4_ = fVar59 * auVar10._0_4_;
    auVar69._4_4_ = fVar90 * auVar10._4_4_;
    auVar69._8_4_ = fVar122 * auVar10._8_4_;
    auVar69._12_4_ = fVar91 * auVar10._12_4_;
    auVar95 = vfmadd231ps_fma(auVar69,(undefined1  [16])aVar3,auVar13);
    auVar11 = vsubps_avx(local_428,(undefined1  [16])aVar2);
    auVar13 = vshufps_avx(auVar11,auVar11,0x55);
    auVar10 = vshufps_avx(auVar11,auVar11,0xaa);
    auVar70._0_4_ = fVar59 * auVar10._0_4_;
    auVar70._4_4_ = fVar90 * auVar10._4_4_;
    auVar70._8_4_ = fVar122 * auVar10._8_4_;
    auVar70._12_4_ = fVar91 * auVar10._12_4_;
    auVar63 = vfmadd231ps_fma(auVar70,(undefined1  [16])aVar3,auVar13);
    auVar10 = vsubps_avx(local_438,(undefined1  [16])aVar2);
    auVar13 = vshufps_avx(auVar10,auVar10,0xaa);
    auVar71._0_4_ = fVar59 * auVar13._0_4_;
    auVar71._4_4_ = fVar90 * auVar13._4_4_;
    auVar71._8_4_ = fVar122 * auVar13._8_4_;
    auVar71._12_4_ = fVar91 * auVar13._12_4_;
    auVar13 = vshufps_avx(auVar10,auVar10,0x55);
    auVar126 = vfmadd231ps_fma(auVar71,(undefined1  [16])aVar3,auVar13);
    auVar12 = vsubps_avx(local_418,(undefined1  [16])aVar2);
    auVar13 = vshufps_avx(auVar12,auVar12,0xaa);
    auVar72._0_4_ = fVar59 * auVar13._0_4_;
    auVar72._4_4_ = fVar90 * auVar13._4_4_;
    auVar72._8_4_ = fVar122 * auVar13._8_4_;
    auVar72._12_4_ = fVar91 * auVar13._12_4_;
    auVar13 = vshufps_avx(auVar12,auVar12,0x55);
    auVar123 = vfmadd231ps_fma(auVar72,(undefined1  [16])aVar3,auVar13);
    auVar248 = vsubps_avx(_local_408,(undefined1  [16])aVar2);
    auVar13 = vshufps_avx(auVar248,auVar248,0xaa);
    auVar154._0_4_ = fVar59 * auVar13._0_4_;
    auVar154._4_4_ = fVar90 * auVar13._4_4_;
    auVar154._8_4_ = fVar122 * auVar13._8_4_;
    auVar154._12_4_ = fVar91 * auVar13._12_4_;
    auVar13 = vshufps_avx(auVar248,auVar248,0x55);
    auVar136 = vfmadd231ps_fma(auVar154,(undefined1  [16])aVar3,auVar13);
    local_448._0_4_ = (fVar92 + auVar153._0_4_) * 0.33333334 + (float)local_408._0_4_;
    local_448._4_4_ = (fVar61 + auVar153._4_4_) * 0.33333334 + (float)local_408._4_4_;
    fStack_440 = (fVar147 + auVar153._8_4_) * 0.33333334 + fStack_400;
    fStack_43c = (fVar222 + auVar153._12_4_) * 0.33333334 + fStack_3fc;
    auVar65 = vsubps_avx(_local_448,(undefined1  [16])aVar2);
    auVar13 = vshufps_avx(auVar65,auVar65,0xaa);
    auVar238._0_4_ = fVar59 * auVar13._0_4_;
    auVar238._4_4_ = fVar90 * auVar13._4_4_;
    auVar238._8_4_ = fVar122 * auVar13._8_4_;
    auVar238._12_4_ = fVar91 * auVar13._12_4_;
    auVar13 = vshufps_avx(auVar65,auVar65,0x55);
    auVar62 = vfmadd231ps_fma(auVar238,(undefined1  [16])aVar3,auVar13);
    auVar225._0_4_ = (fVar183 + auVar67._0_4_) * 0.33333334;
    auVar225._4_4_ = (fVar196 + auVar67._4_4_) * 0.33333334;
    auVar225._8_4_ = (fVar197 + auVar67._8_4_) * 0.33333334;
    auVar225._12_4_ = (fVar198 + auVar67._12_4_) * 0.33333334;
    auVar43._4_4_ = fStack_484;
    auVar43._0_4_ = local_488;
    auVar43._8_4_ = fStack_480;
    auVar43._12_4_ = fStack_47c;
    _local_458 = vsubps_avx(auVar43,auVar225);
    auVar64 = vsubps_avx(_local_458,(undefined1  [16])aVar2);
    auVar13 = vshufps_avx(auVar64,auVar64,0xaa);
    auVar226._0_4_ = fVar59 * auVar13._0_4_;
    auVar226._4_4_ = fVar90 * auVar13._4_4_;
    auVar226._8_4_ = fVar122 * auVar13._8_4_;
    auVar226._12_4_ = fVar91 * auVar13._12_4_;
    auVar13 = vshufps_avx(auVar64,auVar64,0x55);
    auVar94 = vfmadd231ps_fma(auVar226,(undefined1  [16])aVar3,auVar13);
    auVar239 = vsubps_avx(auVar43,(undefined1  [16])aVar2);
    auVar13 = vshufps_avx(auVar239,auVar239,0xaa);
    auVar186._0_4_ = fVar59 * auVar13._0_4_;
    auVar186._4_4_ = fVar90 * auVar13._4_4_;
    auVar186._8_4_ = fVar122 * auVar13._8_4_;
    auVar186._12_4_ = fVar91 * auVar13._12_4_;
    auVar13 = vshufps_avx(auVar239,auVar239,0x55);
    auVar13 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar3,auVar13);
    local_508._0_4_ = auVar129._0_4_;
    auVar171._4_4_ = local_508._0_4_;
    auVar171._0_4_ = local_508._0_4_;
    auVar171._8_4_ = local_508._0_4_;
    auVar171._12_4_ = local_508._0_4_;
    aVar3 = (pre->ray_space).vx.field_0;
    auVar95 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar3,auVar171);
    local_388._0_4_ = auVar11._0_4_;
    auVar172._4_4_ = local_388._0_4_;
    auVar172._0_4_ = local_388._0_4_;
    auVar172._8_4_ = local_388._0_4_;
    auVar172._12_4_ = local_388._0_4_;
    auVar11 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar3,auVar172);
    uVar60 = auVar10._0_4_;
    auVar173._4_4_ = uVar60;
    auVar173._0_4_ = uVar60;
    auVar173._8_4_ = uVar60;
    auVar173._12_4_ = uVar60;
    auVar63 = vfmadd231ps_fma(auVar126,(undefined1  [16])aVar3,auVar173);
    uVar60 = auVar12._0_4_;
    auVar174._4_4_ = uVar60;
    auVar174._0_4_ = uVar60;
    auVar174._8_4_ = uVar60;
    auVar174._12_4_ = uVar60;
    auVar12 = vfmadd231ps_fma(auVar123,(undefined1  [16])aVar3,auVar174);
    uVar60 = auVar248._0_4_;
    auVar175._4_4_ = uVar60;
    auVar175._0_4_ = uVar60;
    auVar175._8_4_ = uVar60;
    auVar175._12_4_ = uVar60;
    auVar248 = vfmadd231ps_fma(auVar136,(undefined1  [16])aVar3,auVar175);
    uVar60 = auVar65._0_4_;
    auVar176._4_4_ = uVar60;
    auVar176._0_4_ = uVar60;
    auVar176._8_4_ = uVar60;
    auVar176._12_4_ = uVar60;
    auVar65 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar3,auVar176);
    uVar60 = auVar64._0_4_;
    auVar73._4_4_ = uVar60;
    auVar73._0_4_ = uVar60;
    auVar73._8_4_ = uVar60;
    auVar73._12_4_ = uVar60;
    auVar64 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar3,auVar73);
    uVar60 = auVar239._0_4_;
    auVar74._4_4_ = uVar60;
    auVar74._0_4_ = uVar60;
    auVar74._8_4_ = uVar60;
    auVar74._12_4_ = uVar60;
    auVar239 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar3,auVar74);
    local_478 = vmovlhps_avx(auVar95,auVar248);
    local_508 = vmovlhps_avx(auVar11,auVar65);
    local_468 = vmovlhps_avx(auVar63,auVar64);
    _local_378 = vmovlhps_avx(auVar12,auVar239);
    auVar13 = vminps_avx(local_478,local_508);
    auVar10 = vminps_avx(local_468,_local_378);
    auVar129 = vminps_avx(auVar13,auVar10);
    auVar13 = vmaxps_avx(local_478,local_508);
    auVar10 = vmaxps_avx(local_468,_local_378);
    auVar13 = vmaxps_avx(auVar13,auVar10);
    auVar10 = vshufpd_avx(auVar129,auVar129,3);
    auVar129 = vminps_avx(auVar129,auVar10);
    auVar10 = vshufpd_avx(auVar13,auVar13,3);
    auVar10 = vmaxps_avx(auVar13,auVar10);
    auVar13 = vandps_avx(local_2f8,auVar129);
    auVar10 = vandps_avx(local_2f8,auVar10);
    auVar13 = vmaxps_avx(auVar13,auVar10);
    auVar10 = vmovshdup_avx(auVar13);
    auVar13 = vmaxss_avx(auVar10,auVar13);
    local_1b8 = auVar13._0_4_ * 9.536743e-07;
    local_4a8._8_8_ = auVar95._0_8_;
    local_4a8._0_8_ = auVar95._0_8_;
    auVar209 = ZEXT1664(local_4a8);
    local_3b8._8_8_ = auVar11._0_8_;
    local_3b8._0_8_ = auVar11._0_8_;
    local_3c8._8_8_ = auVar63._0_8_;
    local_3c8._0_8_ = auVar63._0_8_;
    local_3d8._8_8_ = auVar12._0_8_;
    local_3d8._0_8_ = auVar12._0_8_;
    register0x00001308 = auVar248._0_8_;
    local_3e8 = auVar248._0_8_;
    auVar145 = ZEXT1664(_local_3e8);
    local_4b8._8_8_ = auVar65._0_8_;
    local_4b8._0_8_ = auVar65._0_8_;
    auVar182 = ZEXT1664(local_4b8);
    local_4c8._0_8_ = auVar64._0_8_;
    local_4c8._8_8_ = local_4c8._0_8_;
    auVar235 = ZEXT1664(local_4c8);
    local_4d8._8_8_ = auVar239._0_8_;
    local_4d8._0_8_ = auVar239._0_8_;
    auVar244 = ZEXT1664(local_4d8);
    local_388 = ZEXT416((uint)local_1b8);
    fStack_1b4 = local_1b8;
    fStack_1b0 = local_1b8;
    fStack_1ac = local_1b8;
    fStack_1a8 = local_1b8;
    fStack_1a4 = local_1b8;
    fStack_1a0 = local_1b8;
    fStack_19c = local_1b8;
    fStack_1d0 = -local_1b8;
    local_1d8 = -local_1b8;
    fStack_1d4 = -local_1b8;
    fStack_1cc = fStack_1d0;
    fStack_1c8 = fStack_1d0;
    fStack_1c4 = fStack_1d0;
    fStack_1c0 = fStack_1d0;
    fStack_1bc = fStack_1d0;
    uVar56 = 0;
    local_208 = vsubps_avx(local_508,local_478);
    local_218 = vsubps_avx(local_468,local_508);
    local_228 = vsubps_avx(_local_378,local_468);
    auVar221 = ZEXT1664(local_3d8);
    auVar195 = ZEXT1664(local_3c8);
    auVar165 = ZEXT1664(local_3b8);
    local_248 = vsubps_avx(_local_408,local_3f8);
    local_258 = vsubps_avx(_local_448,local_428);
    local_268 = vsubps_avx(_local_458,local_438);
    auVar44._4_4_ = fStack_484;
    auVar44._0_4_ = local_488;
    auVar44._8_4_ = fStack_480;
    auVar44._12_4_ = fStack_47c;
    _local_278 = vsubps_avx(auVar44,local_418);
    auVar255 = ZEXT1664(ZEXT816(0x3f80000000000000));
    auVar266 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_0162190d:
    auVar136 = auVar255._0_16_;
    local_238 = auVar266._0_16_;
    auVar13 = vshufps_avx(auVar136,auVar136,0x50);
    auVar275._8_4_ = 0x3f800000;
    auVar275._0_8_ = 0x3f8000003f800000;
    auVar275._12_4_ = 0x3f800000;
    auVar278._16_4_ = 0x3f800000;
    auVar278._0_16_ = auVar275;
    auVar278._20_4_ = 0x3f800000;
    auVar278._24_4_ = 0x3f800000;
    auVar278._28_4_ = 0x3f800000;
    auVar10 = vsubps_avx(auVar275,auVar13);
    fVar59 = auVar13._0_4_;
    auVar75._0_4_ = auVar145._0_4_ * fVar59;
    fVar90 = auVar13._4_4_;
    auVar75._4_4_ = auVar145._4_4_ * fVar90;
    fVar122 = auVar13._8_4_;
    auVar75._8_4_ = auVar145._8_4_ * fVar122;
    fVar91 = auVar13._12_4_;
    auVar75._12_4_ = auVar145._12_4_ * fVar91;
    auVar177._0_4_ = auVar182._0_4_ * fVar59;
    auVar177._4_4_ = auVar182._4_4_ * fVar90;
    auVar177._8_4_ = auVar182._8_4_ * fVar122;
    auVar177._12_4_ = auVar182._12_4_ * fVar91;
    auVar139._0_4_ = auVar235._0_4_ * fVar59;
    auVar139._4_4_ = auVar235._4_4_ * fVar90;
    auVar139._8_4_ = auVar235._8_4_ * fVar122;
    auVar139._12_4_ = auVar235._12_4_ * fVar91;
    auVar113._0_4_ = auVar244._0_4_ * fVar59;
    auVar113._4_4_ = auVar244._4_4_ * fVar90;
    auVar113._8_4_ = auVar244._8_4_ * fVar122;
    auVar113._12_4_ = auVar244._12_4_ * fVar91;
    auVar12 = vfmadd231ps_fma(auVar75,auVar10,auVar209._0_16_);
    auVar248 = vfmadd231ps_fma(auVar177,auVar10,auVar165._0_16_);
    auVar65 = vfmadd231ps_fma(auVar139,auVar10,auVar195._0_16_);
    auVar64 = vfmadd231ps_fma(auVar113,auVar221._0_16_,auVar10);
    auVar13 = vmovshdup_avx(auVar266._0_16_);
    fVar59 = auVar266._0_4_;
    fStack_100 = (auVar13._0_4_ - fVar59) * 0.04761905;
    auVar220._4_4_ = fVar59;
    auVar220._0_4_ = fVar59;
    auVar220._8_4_ = fVar59;
    auVar220._12_4_ = fVar59;
    auVar220._16_4_ = fVar59;
    auVar220._20_4_ = fVar59;
    auVar220._24_4_ = fVar59;
    auVar220._28_4_ = fVar59;
    auVar108._0_8_ = auVar13._0_8_;
    auVar108._8_8_ = auVar108._0_8_;
    auVar108._16_8_ = auVar108._0_8_;
    auVar108._24_8_ = auVar108._0_8_;
    auVar87 = vsubps_avx(auVar108,auVar220);
    uVar60 = auVar12._0_4_;
    auVar272._4_4_ = uVar60;
    auVar272._0_4_ = uVar60;
    auVar272._8_4_ = uVar60;
    auVar272._12_4_ = uVar60;
    auVar272._16_4_ = uVar60;
    auVar272._20_4_ = uVar60;
    auVar272._24_4_ = uVar60;
    auVar272._28_4_ = uVar60;
    auVar13 = vmovshdup_avx(auVar12);
    uVar93 = auVar13._0_8_;
    auVar265._8_8_ = uVar93;
    auVar265._0_8_ = uVar93;
    auVar265._16_8_ = uVar93;
    auVar265._24_8_ = uVar93;
    fVar183 = auVar248._0_4_;
    auVar252._4_4_ = fVar183;
    auVar252._0_4_ = fVar183;
    auVar252._8_4_ = fVar183;
    auVar252._12_4_ = fVar183;
    auVar252._16_4_ = fVar183;
    auVar252._20_4_ = fVar183;
    auVar252._24_4_ = fVar183;
    auVar252._28_4_ = fVar183;
    auVar10 = vmovshdup_avx(auVar248);
    auVar109._0_8_ = auVar10._0_8_;
    auVar109._8_8_ = auVar109._0_8_;
    auVar109._16_8_ = auVar109._0_8_;
    auVar109._24_8_ = auVar109._0_8_;
    fVar222 = auVar65._0_4_;
    auVar192._4_4_ = fVar222;
    auVar192._0_4_ = fVar222;
    auVar192._8_4_ = fVar222;
    auVar192._12_4_ = fVar222;
    auVar192._16_4_ = fVar222;
    auVar192._20_4_ = fVar222;
    auVar192._24_4_ = fVar222;
    auVar192._28_4_ = fVar222;
    auVar129 = vmovshdup_avx(auVar65);
    auVar207._0_8_ = auVar129._0_8_;
    auVar207._8_8_ = auVar207._0_8_;
    auVar207._16_8_ = auVar207._0_8_;
    auVar207._24_8_ = auVar207._0_8_;
    fVar147 = auVar64._0_4_;
    auVar11 = vmovshdup_avx(auVar64);
    auVar239 = vfmadd132ps_fma(auVar87,auVar220,_DAT_01faff20);
    auVar87 = vsubps_avx(auVar278,ZEXT1632(auVar239));
    fVar59 = auVar239._0_4_;
    fVar90 = auVar239._4_4_;
    auVar14._4_4_ = fVar183 * fVar90;
    auVar14._0_4_ = fVar183 * fVar59;
    fVar122 = auVar239._8_4_;
    auVar14._8_4_ = fVar183 * fVar122;
    fVar91 = auVar239._12_4_;
    auVar14._12_4_ = fVar183 * fVar91;
    auVar14._16_4_ = fVar183 * 0.0;
    auVar14._20_4_ = fVar183 * 0.0;
    auVar14._24_4_ = fVar183 * 0.0;
    auVar14._28_4_ = 0x3f800000;
    auVar239 = vfmadd231ps_fma(auVar14,auVar87,auVar272);
    fVar92 = auVar10._0_4_;
    fVar61 = auVar10._4_4_;
    auVar15._4_4_ = fVar61 * fVar90;
    auVar15._0_4_ = fVar92 * fVar59;
    auVar15._8_4_ = fVar92 * fVar122;
    auVar15._12_4_ = fVar61 * fVar91;
    auVar15._16_4_ = fVar92 * 0.0;
    auVar15._20_4_ = fVar61 * 0.0;
    auVar15._24_4_ = fVar92 * 0.0;
    auVar15._28_4_ = uVar60;
    auVar95 = vfmadd231ps_fma(auVar15,auVar87,auVar265);
    auVar16._4_4_ = fVar222 * fVar90;
    auVar16._0_4_ = fVar222 * fVar59;
    auVar16._8_4_ = fVar222 * fVar122;
    auVar16._12_4_ = fVar222 * fVar91;
    auVar16._16_4_ = fVar222 * 0.0;
    auVar16._20_4_ = fVar222 * 0.0;
    auVar16._24_4_ = fVar222 * 0.0;
    auVar16._28_4_ = auVar13._4_4_;
    auVar63 = vfmadd231ps_fma(auVar16,auVar87,auVar252);
    fVar92 = auVar129._0_4_;
    fVar61 = auVar129._4_4_;
    auVar9._4_4_ = fVar61 * fVar90;
    auVar9._0_4_ = fVar92 * fVar59;
    auVar9._8_4_ = fVar92 * fVar122;
    auVar9._12_4_ = fVar61 * fVar91;
    auVar9._16_4_ = fVar92 * 0.0;
    auVar9._20_4_ = fVar61 * 0.0;
    auVar9._24_4_ = fVar92 * 0.0;
    auVar9._28_4_ = fVar183;
    auVar126 = vfmadd231ps_fma(auVar9,auVar87,auVar109);
    auVar13 = vshufps_avx(auVar12,auVar12,0xaa);
    local_3a8._8_8_ = auVar13._0_8_;
    local_3a8._0_8_ = local_3a8._8_8_;
    local_3a8._16_8_ = local_3a8._8_8_;
    local_3a8._24_8_ = local_3a8._8_8_;
    auVar10 = vshufps_avx(auVar12,auVar12,0xff);
    uStack_4f0 = auVar10._0_8_;
    local_4f8 = (undefined1  [8])uStack_4f0;
    uStack_4e8 = uStack_4f0;
    uStack_4e0 = uStack_4f0;
    auVar17._4_4_ = fVar147 * fVar90;
    auVar17._0_4_ = fVar147 * fVar59;
    auVar17._8_4_ = fVar147 * fVar122;
    auVar17._12_4_ = fVar147 * fVar91;
    auVar17._16_4_ = fVar147 * 0.0;
    auVar17._20_4_ = fVar147 * 0.0;
    auVar17._24_4_ = fVar147 * 0.0;
    auVar17._28_4_ = fVar147;
    auVar12 = vfmadd231ps_fma(auVar17,auVar87,auVar192);
    auVar10 = vshufps_avx(auVar248,auVar248,0xaa);
    auVar193._0_8_ = auVar10._0_8_;
    auVar193._8_8_ = auVar193._0_8_;
    auVar193._16_8_ = auVar193._0_8_;
    auVar193._24_8_ = auVar193._0_8_;
    auVar129 = vshufps_avx(auVar248,auVar248,0xff);
    local_318._8_8_ = auVar129._0_8_;
    local_318._0_8_ = local_318._8_8_;
    local_318._16_8_ = local_318._8_8_;
    local_318._24_8_ = local_318._8_8_;
    fVar92 = auVar11._0_4_;
    fVar61 = auVar11._4_4_;
    auVar19._4_4_ = fVar61 * fVar90;
    auVar19._0_4_ = fVar92 * fVar59;
    auVar19._8_4_ = fVar92 * fVar122;
    auVar19._12_4_ = fVar61 * fVar91;
    auVar19._16_4_ = fVar92 * 0.0;
    auVar19._20_4_ = fVar61 * 0.0;
    auVar19._24_4_ = fVar92 * 0.0;
    auVar19._28_4_ = auVar13._4_4_;
    auVar123 = vfmadd231ps_fma(auVar19,auVar87,auVar207);
    auVar254._28_4_ = fVar61;
    auVar254._0_28_ =
         ZEXT1628(CONCAT412(auVar63._12_4_ * fVar91,
                            CONCAT48(auVar63._8_4_ * fVar122,
                                     CONCAT44(auVar63._4_4_ * fVar90,auVar63._0_4_ * fVar59))));
    auVar239 = vfmadd231ps_fma(auVar254,auVar87,ZEXT1632(auVar239));
    fVar92 = auVar129._4_4_;
    auVar20._28_4_ = fVar92;
    auVar20._0_28_ =
         ZEXT1628(CONCAT412(auVar126._12_4_ * fVar91,
                            CONCAT48(auVar126._8_4_ * fVar122,
                                     CONCAT44(auVar126._4_4_ * fVar90,auVar126._0_4_ * fVar59))));
    auVar95 = vfmadd231ps_fma(auVar20,auVar87,ZEXT1632(auVar95));
    auVar13 = vshufps_avx(auVar65,auVar65,0xaa);
    uVar93 = auVar13._0_8_;
    auVar181._8_8_ = uVar93;
    auVar181._0_8_ = uVar93;
    auVar181._16_8_ = uVar93;
    auVar181._24_8_ = uVar93;
    auVar11 = vshufps_avx(auVar65,auVar65,0xff);
    uVar93 = auVar11._0_8_;
    auVar279._8_8_ = uVar93;
    auVar279._0_8_ = uVar93;
    auVar279._16_8_ = uVar93;
    auVar279._24_8_ = uVar93;
    auVar65 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar12._12_4_ * fVar91,
                                                 CONCAT48(auVar12._8_4_ * fVar122,
                                                          CONCAT44(auVar12._4_4_ * fVar90,
                                                                   auVar12._0_4_ * fVar59)))),
                              auVar87,ZEXT1632(auVar63));
    auVar12 = vshufps_avx(auVar64,auVar64,0xaa);
    auVar248 = vshufps_avx(auVar64,auVar64,0xff);
    auVar64 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar91 * auVar123._12_4_,
                                                 CONCAT48(fVar122 * auVar123._8_4_,
                                                          CONCAT44(fVar90 * auVar123._4_4_,
                                                                   fVar59 * auVar123._0_4_)))),
                              auVar87,ZEXT1632(auVar126));
    auVar63 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar91 * auVar65._12_4_,
                                                 CONCAT48(fVar122 * auVar65._8_4_,
                                                          CONCAT44(fVar90 * auVar65._4_4_,
                                                                   fVar59 * auVar65._0_4_)))),
                              auVar87,ZEXT1632(auVar239));
    auVar14 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar239));
    auVar65 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar91 * auVar64._12_4_,
                                                 CONCAT48(fVar122 * auVar64._8_4_,
                                                          CONCAT44(fVar90 * auVar64._4_4_,
                                                                   fVar59 * auVar64._0_4_)))),
                              auVar87,ZEXT1632(auVar95));
    auVar15 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar95));
    fStack_2cc = auVar15._28_4_;
    auVar253._0_4_ = fStack_100 * auVar14._0_4_ * 3.0;
    auVar253._4_4_ = fStack_100 * auVar14._4_4_ * 3.0;
    auVar253._8_4_ = fStack_100 * auVar14._8_4_ * 3.0;
    auVar253._12_4_ = fStack_100 * auVar14._12_4_ * 3.0;
    auVar253._16_4_ = fStack_100 * auVar14._16_4_ * 3.0;
    auVar253._20_4_ = fStack_100 * auVar14._20_4_ * 3.0;
    auVar253._24_4_ = fStack_100 * auVar14._24_4_ * 3.0;
    auVar253._28_4_ = 0;
    local_2e8._0_4_ = fStack_100 * auVar15._0_4_ * 3.0;
    local_2e8._4_4_ = fStack_100 * auVar15._4_4_ * 3.0;
    fStack_2e0 = fStack_100 * auVar15._8_4_ * 3.0;
    fStack_2dc = fStack_100 * auVar15._12_4_ * 3.0;
    fStack_2d8 = fStack_100 * auVar15._16_4_ * 3.0;
    fStack_2d4 = fStack_100 * auVar15._20_4_ * 3.0;
    fStack_2d0 = fStack_100 * auVar15._24_4_ * 3.0;
    fVar61 = auVar10._0_4_;
    fVar147 = auVar10._4_4_;
    auVar21._4_4_ = fVar147 * fVar90;
    auVar21._0_4_ = fVar61 * fVar59;
    auVar21._8_4_ = fVar61 * fVar122;
    auVar21._12_4_ = fVar147 * fVar91;
    auVar21._16_4_ = fVar61 * 0.0;
    auVar21._20_4_ = fVar147 * 0.0;
    auVar21._24_4_ = fVar61 * 0.0;
    auVar21._28_4_ = fStack_2cc;
    auVar10 = vfmadd231ps_fma(auVar21,auVar87,local_3a8);
    fVar61 = auVar129._0_4_;
    auVar22._4_4_ = fVar92 * fVar90;
    auVar22._0_4_ = fVar61 * fVar59;
    auVar22._8_4_ = fVar61 * fVar122;
    auVar22._12_4_ = fVar92 * fVar91;
    auVar22._16_4_ = fVar61 * 0.0;
    auVar22._20_4_ = fVar92 * 0.0;
    auVar22._24_4_ = fVar61 * 0.0;
    auVar22._28_4_ = 0;
    auVar129 = vfmadd231ps_fma(auVar22,auVar87,_local_4f8);
    fVar92 = auVar13._0_4_;
    fVar61 = auVar13._4_4_;
    auVar23._4_4_ = fVar61 * fVar90;
    auVar23._0_4_ = fVar92 * fVar59;
    auVar23._8_4_ = fVar92 * fVar122;
    auVar23._12_4_ = fVar61 * fVar91;
    auVar23._16_4_ = fVar92 * 0.0;
    auVar23._20_4_ = fVar61 * 0.0;
    auVar23._24_4_ = fVar92 * 0.0;
    auVar23._28_4_ = auVar14._28_4_;
    auVar13 = vfmadd231ps_fma(auVar23,auVar87,auVar193);
    fVar92 = auVar11._0_4_;
    fVar222 = auVar11._4_4_;
    auVar24._4_4_ = fVar222 * fVar90;
    auVar24._0_4_ = fVar92 * fVar59;
    auVar24._8_4_ = fVar92 * fVar122;
    auVar24._12_4_ = fVar222 * fVar91;
    auVar24._16_4_ = fVar92 * 0.0;
    auVar24._20_4_ = fVar222 * 0.0;
    auVar24._24_4_ = fVar92 * 0.0;
    auVar24._28_4_ = fVar147;
    auVar11 = vfmadd231ps_fma(auVar24,auVar87,local_318);
    local_318 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar63));
    fVar92 = auVar12._0_4_;
    fVar61 = auVar12._4_4_;
    auVar25._4_4_ = fVar61 * fVar90;
    auVar25._0_4_ = fVar92 * fVar59;
    auVar25._8_4_ = fVar92 * fVar122;
    auVar25._12_4_ = fVar61 * fVar91;
    auVar25._16_4_ = fVar92 * 0.0;
    auVar25._20_4_ = fVar61 * 0.0;
    auVar25._24_4_ = fVar92 * 0.0;
    auVar25._28_4_ = fVar61;
    auVar12 = vfmadd231ps_fma(auVar25,auVar87,auVar181);
    _local_4f8 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar65));
    auVar19 = _local_4f8;
    fVar92 = auVar248._0_4_;
    fVar61 = auVar248._4_4_;
    auVar26._4_4_ = fVar61 * fVar90;
    auVar26._0_4_ = fVar92 * fVar59;
    auVar26._8_4_ = fVar92 * fVar122;
    auVar26._12_4_ = fVar61 * fVar91;
    auVar26._16_4_ = fVar92 * 0.0;
    auVar26._20_4_ = fVar61 * 0.0;
    auVar26._24_4_ = fVar92 * 0.0;
    auVar26._28_4_ = fVar61;
    auVar248 = vfmadd231ps_fma(auVar26,auVar87,auVar279);
    auVar27._28_4_ = fVar222;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(auVar13._12_4_ * fVar91,
                            CONCAT48(auVar13._8_4_ * fVar122,
                                     CONCAT44(auVar13._4_4_ * fVar90,auVar13._0_4_ * fVar59))));
    auVar10 = vfmadd231ps_fma(auVar27,auVar87,ZEXT1632(auVar10));
    auVar129 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar91 * auVar11._12_4_,
                                                  CONCAT48(fVar122 * auVar11._8_4_,
                                                           CONCAT44(fVar90 * auVar11._4_4_,
                                                                    fVar59 * auVar11._0_4_)))),
                               auVar87,ZEXT1632(auVar129));
    local_3a8._0_4_ = auVar63._0_4_ + auVar253._0_4_;
    local_3a8._4_4_ = auVar63._4_4_ + auVar253._4_4_;
    local_3a8._8_4_ = auVar63._8_4_ + auVar253._8_4_;
    local_3a8._12_4_ = auVar63._12_4_ + auVar253._12_4_;
    local_3a8._16_4_ = auVar253._16_4_ + 0.0;
    local_3a8._20_4_ = auVar253._20_4_ + 0.0;
    local_3a8._24_4_ = auVar253._24_4_ + 0.0;
    local_3a8._28_4_ = 0;
    auVar13 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar12._12_4_ * fVar91,
                                                 CONCAT48(auVar12._8_4_ * fVar122,
                                                          CONCAT44(auVar12._4_4_ * fVar90,
                                                                   auVar12._0_4_ * fVar59)))),
                              auVar87,ZEXT1632(auVar13));
    auVar11 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar248._12_4_ * fVar91,
                                                 CONCAT48(auVar248._8_4_ * fVar122,
                                                          CONCAT44(auVar248._4_4_ * fVar90,
                                                                   auVar248._0_4_ * fVar59)))),
                              auVar87,ZEXT1632(auVar11));
    auVar12 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar91 * auVar13._12_4_,
                                                 CONCAT48(fVar122 * auVar13._8_4_,
                                                          CONCAT44(fVar90 * auVar13._4_4_,
                                                                   fVar59 * auVar13._0_4_)))),
                              auVar87,ZEXT1632(auVar10));
    auVar248 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar11._12_4_ * fVar91,
                                                  CONCAT48(auVar11._8_4_ * fVar122,
                                                           CONCAT44(auVar11._4_4_ * fVar90,
                                                                    auVar11._0_4_ * fVar59)))),
                               ZEXT1632(auVar129),auVar87);
    auVar87 = vsubps_avx(ZEXT1632(auVar13),ZEXT1632(auVar10));
    auVar14 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar129));
    auVar273._0_4_ = fStack_100 * auVar87._0_4_ * 3.0;
    auVar273._4_4_ = fStack_100 * auVar87._4_4_ * 3.0;
    auVar273._8_4_ = fStack_100 * auVar87._8_4_ * 3.0;
    auVar273._12_4_ = fStack_100 * auVar87._12_4_ * 3.0;
    auVar273._16_4_ = fStack_100 * auVar87._16_4_ * 3.0;
    auVar273._20_4_ = fStack_100 * auVar87._20_4_ * 3.0;
    auVar273._24_4_ = fStack_100 * auVar87._24_4_ * 3.0;
    auVar273._28_4_ = 0;
    local_118 = fStack_100 * auVar14._0_4_ * 3.0;
    fStack_114 = fStack_100 * auVar14._4_4_ * 3.0;
    auVar28._4_4_ = fStack_114;
    auVar28._0_4_ = local_118;
    fStack_110 = fStack_100 * auVar14._8_4_ * 3.0;
    auVar28._8_4_ = fStack_110;
    fStack_10c = fStack_100 * auVar14._12_4_ * 3.0;
    auVar28._12_4_ = fStack_10c;
    fStack_108 = fStack_100 * auVar14._16_4_ * 3.0;
    auVar28._16_4_ = fStack_108;
    fStack_104 = fStack_100 * auVar14._20_4_ * 3.0;
    auVar28._20_4_ = fStack_104;
    fStack_100 = fStack_100 * auVar14._24_4_ * 3.0;
    auVar28._24_4_ = fStack_100;
    auVar28._28_4_ = 0x40400000;
    _local_338 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar12));
    local_1f8 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar248));
    auVar87 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar63));
    auVar14 = vsubps_avx(ZEXT1632(auVar248),ZEXT1632(auVar65));
    auVar15 = vsubps_avx(_local_338,local_318);
    fVar183 = auVar87._0_4_ + auVar15._0_4_;
    fVar196 = auVar87._4_4_ + auVar15._4_4_;
    fVar197 = auVar87._8_4_ + auVar15._8_4_;
    fVar198 = auVar87._12_4_ + auVar15._12_4_;
    fVar146 = auVar87._16_4_ + auVar15._16_4_;
    fVar166 = auVar87._20_4_ + auVar15._20_4_;
    fVar167 = auVar87._24_4_ + auVar15._24_4_;
    auVar16 = vsubps_avx(local_1f8,_local_4f8);
    auVar88._0_4_ = auVar14._0_4_ + auVar16._0_4_;
    auVar88._4_4_ = auVar14._4_4_ + auVar16._4_4_;
    auVar88._8_4_ = auVar14._8_4_ + auVar16._8_4_;
    auVar88._12_4_ = auVar14._12_4_ + auVar16._12_4_;
    auVar88._16_4_ = auVar14._16_4_ + auVar16._16_4_;
    auVar88._20_4_ = auVar14._20_4_ + auVar16._20_4_;
    auVar88._24_4_ = auVar14._24_4_ + auVar16._24_4_;
    auVar88._28_4_ = auVar14._28_4_ + auVar16._28_4_;
    local_b8 = ZEXT1632(auVar65);
    fVar59 = auVar65._0_4_;
    local_138 = (float)local_2e8._0_4_ + fVar59;
    fVar90 = auVar65._4_4_;
    fStack_134 = (float)local_2e8._4_4_ + fVar90;
    fVar122 = auVar65._8_4_;
    fStack_130 = fStack_2e0 + fVar122;
    fVar91 = auVar65._12_4_;
    fStack_12c = fStack_2dc + fVar91;
    fStack_128 = fStack_2d8 + 0.0;
    fStack_124 = fStack_2d4 + 0.0;
    fStack_120 = fStack_2d0 + 0.0;
    local_78 = ZEXT1632(auVar63);
    auVar14 = vsubps_avx(local_78,auVar253);
    local_98 = vpermps_avx2(_DAT_01fec480,auVar14);
    auVar14 = vsubps_avx(local_b8,_local_2e8);
    local_158 = vpermps_avx2(_DAT_01fec480,auVar14);
    local_d8._0_4_ = auVar12._0_4_ + auVar273._0_4_;
    local_d8._4_4_ = auVar12._4_4_ + auVar273._4_4_;
    local_d8._8_4_ = auVar12._8_4_ + auVar273._8_4_;
    local_d8._12_4_ = auVar12._12_4_ + auVar273._12_4_;
    local_d8._16_4_ = auVar273._16_4_ + 0.0;
    local_d8._20_4_ = auVar273._20_4_ + 0.0;
    local_d8._24_4_ = auVar273._24_4_ + 0.0;
    local_d8._28_4_ = 0;
    auVar145 = ZEXT3264(local_d8);
    auVar254 = ZEXT1632(auVar12);
    auVar14 = vsubps_avx(auVar254,auVar273);
    auVar17 = vpermps_avx2(_DAT_01fec480,auVar14);
    fVar92 = auVar248._0_4_;
    local_118 = fVar92 + local_118;
    fVar61 = auVar248._4_4_;
    fStack_114 = fVar61 + fStack_114;
    fVar147 = auVar248._8_4_;
    fStack_110 = fVar147 + fStack_110;
    fVar222 = auVar248._12_4_;
    fStack_10c = fVar222 + fStack_10c;
    fStack_108 = fStack_108 + 0.0;
    fStack_104 = fStack_104 + 0.0;
    fStack_100 = fStack_100 + 0.0;
    auVar14 = vsubps_avx(ZEXT1632(auVar248),auVar28);
    local_f8 = vpermps_avx2(_DAT_01fec480,auVar14);
    auVar29._4_4_ = fVar90 * fVar196;
    auVar29._0_4_ = fVar59 * fVar183;
    auVar29._8_4_ = fVar122 * fVar197;
    auVar29._12_4_ = fVar91 * fVar198;
    auVar29._16_4_ = fVar146 * 0.0;
    auVar29._20_4_ = fVar166 * 0.0;
    auVar29._24_4_ = fVar167 * 0.0;
    auVar29._28_4_ = auVar14._28_4_;
    auVar13 = vfnmadd231ps_fma(auVar29,local_78,auVar88);
    fStack_11c = fStack_2cc + 0.0;
    auVar30._4_4_ = fStack_134 * fVar196;
    auVar30._0_4_ = local_138 * fVar183;
    auVar30._8_4_ = fStack_130 * fVar197;
    auVar30._12_4_ = fStack_12c * fVar198;
    auVar30._16_4_ = fStack_128 * fVar146;
    auVar30._20_4_ = fStack_124 * fVar166;
    auVar30._24_4_ = fStack_120 * fVar167;
    auVar30._28_4_ = 0;
    auVar10 = vfnmadd231ps_fma(auVar30,auVar88,local_3a8);
    auVar31._4_4_ = local_158._4_4_ * fVar196;
    auVar31._0_4_ = local_158._0_4_ * fVar183;
    auVar31._8_4_ = local_158._8_4_ * fVar197;
    auVar31._12_4_ = local_158._12_4_ * fVar198;
    auVar31._16_4_ = local_158._16_4_ * fVar146;
    auVar31._20_4_ = local_158._20_4_ * fVar166;
    auVar31._24_4_ = local_158._24_4_ * fVar167;
    auVar31._28_4_ = fStack_2cc + 0.0;
    auVar129 = vfnmadd231ps_fma(auVar31,local_98,auVar88);
    auVar32._4_4_ = (float)local_4f8._4_4_ * fVar196;
    auVar32._0_4_ = (float)local_4f8._0_4_ * fVar183;
    auVar32._8_4_ = (float)uStack_4f0 * fVar197;
    auVar32._12_4_ = uStack_4f0._4_4_ * fVar198;
    auVar32._16_4_ = (float)uStack_4e8 * fVar146;
    auVar32._20_4_ = uStack_4e8._4_4_ * fVar166;
    auVar32._24_4_ = (float)uStack_4e0 * fVar167;
    auVar32._28_4_ = uStack_4e0._4_4_;
    auVar11 = vfnmadd231ps_fma(auVar32,local_318,auVar88);
    auVar208._0_4_ = fVar92 * fVar183;
    auVar208._4_4_ = fVar61 * fVar196;
    auVar208._8_4_ = fVar147 * fVar197;
    auVar208._12_4_ = fVar222 * fVar198;
    auVar208._16_4_ = fVar146 * 0.0;
    auVar208._20_4_ = fVar166 * 0.0;
    auVar208._24_4_ = fVar167 * 0.0;
    auVar208._28_4_ = 0;
    auVar12 = vfnmadd231ps_fma(auVar208,auVar254,auVar88);
    uStack_fc = 0x40400000;
    auVar33._4_4_ = fStack_114 * fVar196;
    auVar33._0_4_ = local_118 * fVar183;
    auVar33._8_4_ = fStack_110 * fVar197;
    auVar33._12_4_ = fStack_10c * fVar198;
    auVar33._16_4_ = fStack_108 * fVar146;
    auVar33._20_4_ = fStack_104 * fVar166;
    auVar33._24_4_ = fStack_100 * fVar167;
    auVar33._28_4_ = local_318._28_4_;
    auVar65 = vfnmadd231ps_fma(auVar33,local_d8,auVar88);
    auVar34._4_4_ = local_f8._4_4_ * fVar196;
    auVar34._0_4_ = local_f8._0_4_ * fVar183;
    auVar34._8_4_ = local_f8._8_4_ * fVar197;
    auVar34._12_4_ = local_f8._12_4_ * fVar198;
    auVar34._16_4_ = local_f8._16_4_ * fVar146;
    auVar34._20_4_ = local_f8._20_4_ * fVar166;
    auVar34._24_4_ = local_f8._24_4_ * fVar167;
    auVar34._28_4_ = local_f8._28_4_;
    _local_2e8 = auVar17;
    auVar64 = vfnmadd231ps_fma(auVar34,auVar17,auVar88);
    auVar35._4_4_ = local_1f8._4_4_ * fVar196;
    auVar35._0_4_ = local_1f8._0_4_ * fVar183;
    auVar35._8_4_ = local_1f8._8_4_ * fVar197;
    auVar35._12_4_ = local_1f8._12_4_ * fVar198;
    auVar35._16_4_ = local_1f8._16_4_ * fVar146;
    auVar35._20_4_ = local_1f8._20_4_ * fVar166;
    auVar35._24_4_ = local_1f8._24_4_ * fVar167;
    auVar35._28_4_ = auVar87._28_4_ + auVar15._28_4_;
    auVar239 = vfnmadd231ps_fma(auVar35,_local_338,auVar88);
    auVar14 = vminps_avx(ZEXT1632(auVar13),ZEXT1632(auVar10));
    auVar87 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar10));
    auVar15 = vminps_avx(ZEXT1632(auVar129),ZEXT1632(auVar11));
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(ZEXT1632(auVar129),ZEXT1632(auVar11));
    auVar87 = vmaxps_avx(auVar87,auVar14);
    auVar16 = vminps_avx(ZEXT1632(auVar12),ZEXT1632(auVar65));
    auVar14 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar65));
    auVar9 = vminps_avx(ZEXT1632(auVar64),ZEXT1632(auVar239));
    auVar16 = vminps_avx(auVar16,auVar9);
    auVar16 = vminps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(ZEXT1632(auVar64),ZEXT1632(auVar239));
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar87,auVar14);
    auVar48._4_4_ = fStack_1b4;
    auVar48._0_4_ = local_1b8;
    auVar48._8_4_ = fStack_1b0;
    auVar48._12_4_ = fStack_1ac;
    auVar48._16_4_ = fStack_1a8;
    auVar48._20_4_ = fStack_1a4;
    auVar48._24_4_ = fStack_1a0;
    auVar48._28_4_ = fStack_19c;
    auVar87 = vcmpps_avx(auVar16,auVar48,2);
    auVar46._4_4_ = fStack_1d4;
    auVar46._0_4_ = local_1d8;
    auVar46._8_4_ = fStack_1d0;
    auVar46._12_4_ = fStack_1cc;
    auVar46._16_4_ = fStack_1c8;
    auVar46._20_4_ = fStack_1c4;
    auVar46._24_4_ = fStack_1c0;
    auVar46._28_4_ = fStack_1bc;
    auVar14 = vcmpps_avx(auVar14,auVar46,5);
    auVar87 = vandps_avx(auVar14,auVar87);
    auVar14 = local_178 & auVar87;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      auVar14 = vsubps_avx(local_318,local_78);
      auVar15 = vsubps_avx(_local_338,auVar254);
      fVar196 = auVar14._0_4_ + auVar15._0_4_;
      fVar197 = auVar14._4_4_ + auVar15._4_4_;
      fVar198 = auVar14._8_4_ + auVar15._8_4_;
      fVar146 = auVar14._12_4_ + auVar15._12_4_;
      fVar166 = auVar14._16_4_ + auVar15._16_4_;
      fVar167 = auVar14._20_4_ + auVar15._20_4_;
      fVar168 = auVar14._24_4_ + auVar15._24_4_;
      auVar16 = vsubps_avx(_local_4f8,local_b8);
      auVar9 = vsubps_avx(local_1f8,ZEXT1632(auVar248));
      auVar110._0_4_ = auVar16._0_4_ + auVar9._0_4_;
      auVar110._4_4_ = auVar16._4_4_ + auVar9._4_4_;
      auVar110._8_4_ = auVar16._8_4_ + auVar9._8_4_;
      auVar110._12_4_ = auVar16._12_4_ + auVar9._12_4_;
      auVar110._16_4_ = auVar16._16_4_ + auVar9._16_4_;
      auVar110._20_4_ = auVar16._20_4_ + auVar9._20_4_;
      auVar110._24_4_ = auVar16._24_4_ + auVar9._24_4_;
      fVar183 = auVar9._28_4_;
      auVar110._28_4_ = auVar16._28_4_ + fVar183;
      auVar36._4_4_ = fVar90 * fVar197;
      auVar36._0_4_ = fVar59 * fVar196;
      auVar36._8_4_ = fVar122 * fVar198;
      auVar36._12_4_ = fVar91 * fVar146;
      auVar36._16_4_ = fVar166 * 0.0;
      auVar36._20_4_ = fVar167 * 0.0;
      auVar36._24_4_ = fVar168 * 0.0;
      auVar36._28_4_ = local_338._28_4_;
      auVar12 = vfnmadd231ps_fma(auVar36,auVar110,local_78);
      auVar37._4_4_ = fVar197 * fStack_134;
      auVar37._0_4_ = fVar196 * local_138;
      auVar37._8_4_ = fVar198 * fStack_130;
      auVar37._12_4_ = fVar146 * fStack_12c;
      auVar37._16_4_ = fVar166 * fStack_128;
      auVar37._20_4_ = fVar167 * fStack_124;
      auVar37._24_4_ = fVar168 * fStack_120;
      auVar37._28_4_ = 0;
      auVar13 = vfnmadd213ps_fma(local_3a8,auVar110,auVar37);
      auVar38._4_4_ = fVar197 * local_158._4_4_;
      auVar38._0_4_ = fVar196 * local_158._0_4_;
      auVar38._8_4_ = fVar198 * local_158._8_4_;
      auVar38._12_4_ = fVar146 * local_158._12_4_;
      auVar38._16_4_ = fVar166 * local_158._16_4_;
      auVar38._20_4_ = fVar167 * local_158._20_4_;
      auVar38._24_4_ = fVar168 * local_158._24_4_;
      auVar38._28_4_ = 0;
      auVar10 = vfnmadd213ps_fma(local_98,auVar110,auVar38);
      auVar39._4_4_ = (float)local_4f8._4_4_ * fVar197;
      auVar39._0_4_ = (float)local_4f8._0_4_ * fVar196;
      auVar39._8_4_ = (float)uStack_4f0 * fVar198;
      auVar39._12_4_ = uStack_4f0._4_4_ * fVar146;
      auVar39._16_4_ = (float)uStack_4e8 * fVar166;
      auVar39._20_4_ = uStack_4e8._4_4_ * fVar167;
      auVar39._24_4_ = (float)uStack_4e0 * fVar168;
      auVar39._28_4_ = 0;
      auVar248 = vfnmadd231ps_fma(auVar39,auVar110,local_318);
      auVar133._0_4_ = fVar92 * fVar196;
      auVar133._4_4_ = fVar61 * fVar197;
      auVar133._8_4_ = fVar147 * fVar198;
      auVar133._12_4_ = fVar222 * fVar146;
      auVar133._16_4_ = fVar166 * 0.0;
      auVar133._20_4_ = fVar167 * 0.0;
      auVar133._24_4_ = fVar168 * 0.0;
      auVar133._28_4_ = 0;
      auVar65 = vfnmadd231ps_fma(auVar133,auVar110,auVar254);
      auVar40._4_4_ = fVar197 * fStack_114;
      auVar40._0_4_ = fVar196 * local_118;
      auVar40._8_4_ = fVar198 * fStack_110;
      auVar40._12_4_ = fVar146 * fStack_10c;
      auVar40._16_4_ = fVar166 * fStack_108;
      auVar40._20_4_ = fVar167 * fStack_104;
      auVar40._24_4_ = fVar168 * fStack_100;
      auVar40._28_4_ = fVar183;
      auVar129 = vfnmadd213ps_fma(local_d8,auVar110,auVar40);
      auVar41._4_4_ = fVar197 * local_f8._4_4_;
      auVar41._0_4_ = fVar196 * local_f8._0_4_;
      auVar41._8_4_ = fVar198 * local_f8._8_4_;
      auVar41._12_4_ = fVar146 * local_f8._12_4_;
      auVar41._16_4_ = fVar166 * local_f8._16_4_;
      auVar41._20_4_ = fVar167 * local_f8._20_4_;
      auVar41._24_4_ = fVar168 * local_f8._24_4_;
      auVar41._28_4_ = fVar183;
      auVar11 = vfnmadd213ps_fma(auVar17,auVar110,auVar41);
      auVar145 = ZEXT1664(auVar11);
      auVar42._4_4_ = local_1f8._4_4_ * fVar197;
      auVar42._0_4_ = local_1f8._0_4_ * fVar196;
      auVar42._8_4_ = local_1f8._8_4_ * fVar198;
      auVar42._12_4_ = local_1f8._12_4_ * fVar146;
      auVar42._16_4_ = local_1f8._16_4_ * fVar166;
      auVar42._20_4_ = local_1f8._20_4_ * fVar167;
      auVar42._24_4_ = local_1f8._24_4_ * fVar168;
      auVar42._28_4_ = auVar14._28_4_ + auVar15._28_4_;
      auVar64 = vfnmadd231ps_fma(auVar42,auVar110,_local_338);
      auVar15 = vminps_avx(ZEXT1632(auVar12),ZEXT1632(auVar13));
      auVar14 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar13));
      auVar16 = vminps_avx(ZEXT1632(auVar10),ZEXT1632(auVar248));
      auVar16 = vminps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar248));
      auVar14 = vmaxps_avx(auVar14,auVar15);
      auVar9 = vminps_avx(ZEXT1632(auVar65),ZEXT1632(auVar129));
      auVar15 = vmaxps_avx(ZEXT1632(auVar65),ZEXT1632(auVar129));
      auVar17 = vminps_avx(ZEXT1632(auVar11),ZEXT1632(auVar64));
      auVar9 = vminps_avx(auVar9,auVar17);
      auVar9 = vminps_avx(auVar16,auVar9);
      auVar16 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar64));
      auVar15 = vmaxps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(auVar14,auVar15);
      auVar49._4_4_ = fStack_1b4;
      auVar49._0_4_ = local_1b8;
      auVar49._8_4_ = fStack_1b0;
      auVar49._12_4_ = fStack_1ac;
      auVar49._16_4_ = fStack_1a8;
      auVar49._20_4_ = fStack_1a4;
      auVar49._24_4_ = fStack_1a0;
      auVar49._28_4_ = fStack_19c;
      auVar14 = vcmpps_avx(auVar9,auVar49,2);
      auVar47._4_4_ = fStack_1d4;
      auVar47._0_4_ = local_1d8;
      auVar47._8_4_ = fStack_1d0;
      auVar47._12_4_ = fStack_1cc;
      auVar47._16_4_ = fStack_1c8;
      auVar47._20_4_ = fStack_1c4;
      auVar47._24_4_ = fStack_1c0;
      auVar47._28_4_ = fStack_1bc;
      auVar15 = vcmpps_avx(auVar15,auVar47,5);
      auVar14 = vandps_avx(auVar15,auVar14);
      auVar87 = vandps_avx(auVar87,local_178);
      auVar15 = auVar87 & auVar14;
      if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0x7f,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0xbf,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar15[0x1f] < '\0') {
        auVar87 = vandps_avx(auVar14,auVar87);
        uVar55 = vmovmskps_avx(auVar87);
        if (uVar55 != 0) {
          uVar58 = (ulong)uVar56;
          auStack_2c8[uVar58] = uVar55 & 0xff;
          uVar93 = vmovlps_avx(local_238);
          *(undefined8 *)(&uStack_198 + uVar58 * 2) = uVar93;
          uVar51 = vmovlps_avx(auVar136);
          auStack_58[uVar58] = uVar51;
          uVar56 = uVar56 + 1;
        }
      }
    }
    _local_4f8 = auVar19;
    if (uVar56 != 0) {
      do {
        auVar244 = ZEXT1664(local_4d8);
        auVar235 = ZEXT1664(local_4c8);
        auVar209 = ZEXT1664(local_4a8);
        auVar182 = ZEXT1664(local_4b8);
        uVar58 = (ulong)(uVar56 - 1);
        uVar54 = auStack_2c8[uVar58];
        uVar55 = (&uStack_198)[uVar58 * 2];
        fVar59 = afStack_194[uVar58 * 2];
        iVar18 = 0;
        for (uVar51 = (ulong)uVar54; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000) {
          iVar18 = iVar18 + 1;
        }
        uVar54 = uVar54 - 1 & uVar54;
        if (uVar54 == 0) {
          uVar56 = uVar56 - 1;
        }
        auVar247._8_8_ = 0;
        auVar247._0_8_ = auStack_58[uVar58];
        auVar255 = ZEXT1664(auVar247);
        auStack_2c8[uVar58] = uVar54;
        fVar90 = (float)(iVar18 + 1) * 0.14285715;
        auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar59 * (float)iVar18 * 0.14285715)),
                                  ZEXT416(uVar55),ZEXT416((uint)(1.0 - (float)iVar18 * 0.14285715)))
        ;
        auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar59 * fVar90)),ZEXT416(uVar55),
                                  ZEXT416((uint)(1.0 - fVar90)));
        fVar90 = auVar10._0_4_;
        auVar194._0_4_ = auVar13._0_4_;
        fVar59 = fVar90 - auVar194._0_4_;
        if (0.16666667 <= fVar59) {
          auVar13 = vinsertps_avx(auVar13,auVar10,0x10);
          auVar266 = ZEXT1664(auVar13);
          auVar165 = ZEXT1664(local_3b8);
          auVar195 = ZEXT1664(local_3c8);
          auVar221 = ZEXT1664(local_3d8);
          auVar145 = ZEXT1664(_local_3e8);
          goto LAB_0162190d;
        }
        auVar129 = vshufps_avx(auVar247,auVar247,0x50);
        auVar99._8_4_ = 0x3f800000;
        auVar99._0_8_ = 0x3f8000003f800000;
        auVar99._12_4_ = 0x3f800000;
        auVar11 = vsubps_avx(auVar99,auVar129);
        fVar122 = auVar129._0_4_;
        auVar140._0_4_ = fVar122 * (float)local_3e8._0_4_;
        fVar91 = auVar129._4_4_;
        auVar140._4_4_ = fVar91 * (float)local_3e8._4_4_;
        fVar92 = auVar129._8_4_;
        auVar140._8_4_ = fVar92 * fStack_3e0;
        fVar61 = auVar129._12_4_;
        auVar140._12_4_ = fVar61 * fStack_3dc;
        auVar155._0_4_ = local_4b8._0_4_ * fVar122;
        auVar155._4_4_ = local_4b8._4_4_ * fVar91;
        auVar155._8_4_ = local_4b8._8_4_ * fVar92;
        auVar155._12_4_ = local_4b8._12_4_ * fVar61;
        auVar178._0_4_ = local_4c8._0_4_ * fVar122;
        auVar178._4_4_ = local_4c8._4_4_ * fVar91;
        auVar178._8_4_ = local_4c8._8_4_ * fVar92;
        auVar178._12_4_ = local_4c8._12_4_ * fVar61;
        auVar76._0_4_ = local_4d8._0_4_ * fVar122;
        auVar76._4_4_ = local_4d8._4_4_ * fVar91;
        auVar76._8_4_ = local_4d8._8_4_ * fVar92;
        auVar76._12_4_ = local_4d8._12_4_ * fVar61;
        auVar129 = vfmadd231ps_fma(auVar140,auVar11,local_4a8);
        auVar12 = vfmadd231ps_fma(auVar155,auVar11,local_3b8);
        auVar248 = vfmadd231ps_fma(auVar178,auVar11,local_3c8);
        auVar11 = vfmadd231ps_fma(auVar76,auVar11,local_3d8);
        auVar134._16_16_ = auVar129;
        auVar134._0_16_ = auVar129;
        auVar144._16_16_ = auVar12;
        auVar144._0_16_ = auVar12;
        auVar164._16_16_ = auVar248;
        auVar164._0_16_ = auVar248;
        _local_4f8 = auVar13;
        auVar194._4_4_ = auVar194._0_4_;
        auVar194._8_4_ = auVar194._0_4_;
        auVar194._12_4_ = auVar194._0_4_;
        auVar194._20_4_ = fVar90;
        auVar194._16_4_ = fVar90;
        auVar194._24_4_ = fVar90;
        auVar194._28_4_ = fVar90;
        auVar87 = vsubps_avx(auVar144,auVar134);
        auVar12 = vfmadd213ps_fma(auVar87,auVar194,auVar134);
        auVar87 = vsubps_avx(auVar164,auVar144);
        auVar65 = vfmadd213ps_fma(auVar87,auVar194,auVar144);
        auVar129 = vsubps_avx(auVar11,auVar248);
        auVar89._16_16_ = auVar129;
        auVar89._0_16_ = auVar129;
        auVar129 = vfmadd213ps_fma(auVar89,auVar194,auVar164);
        auVar87 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar12));
        auVar11 = vfmadd213ps_fma(auVar87,auVar194,ZEXT1632(auVar12));
        auVar87 = vsubps_avx(ZEXT1632(auVar129),ZEXT1632(auVar65));
        auVar129 = vfmadd213ps_fma(auVar87,auVar194,ZEXT1632(auVar65));
        auVar87 = vsubps_avx(ZEXT1632(auVar129),ZEXT1632(auVar11));
        auVar95 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar87,auVar194);
        fVar222 = auVar87._4_4_ * 3.0;
        local_318._0_4_ = fVar59;
        fVar122 = fVar59 * 0.33333334;
        local_1f8._0_8_ =
             CONCAT44(auVar95._4_4_ + fVar122 * fVar222,
                      auVar95._0_4_ + fVar122 * auVar87._0_4_ * 3.0);
        local_1f8._8_4_ = auVar95._8_4_ + fVar122 * auVar87._8_4_ * 3.0;
        local_1f8._12_4_ = auVar95._12_4_ + fVar122 * auVar87._12_4_ * 3.0;
        auVar11 = vshufpd_avx(auVar95,auVar95,3);
        auVar12 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        _local_2e8 = auVar11;
        auVar129 = vsubps_avx(auVar11,auVar95);
        _local_338 = auVar12;
        auVar248 = vsubps_avx(auVar12,(undefined1  [16])0x0);
        auVar77._0_4_ = auVar129._0_4_ + auVar248._0_4_;
        auVar77._4_4_ = auVar129._4_4_ + auVar248._4_4_;
        auVar77._8_4_ = auVar129._8_4_ + auVar248._8_4_;
        auVar77._12_4_ = auVar129._12_4_ + auVar248._12_4_;
        auVar129 = vshufps_avx(auVar95,auVar95,0xb1);
        auVar248 = vshufps_avx(local_1f8._0_16_,local_1f8._0_16_,0xb1);
        auVar269._4_4_ = auVar77._0_4_;
        auVar269._0_4_ = auVar77._0_4_;
        auVar269._8_4_ = auVar77._0_4_;
        auVar269._12_4_ = auVar77._0_4_;
        auVar65 = vshufps_avx(auVar77,auVar77,0x55);
        fVar91 = auVar65._0_4_;
        auVar78._0_4_ = fVar91 * auVar129._0_4_;
        fVar92 = auVar65._4_4_;
        auVar78._4_4_ = fVar92 * auVar129._4_4_;
        fVar61 = auVar65._8_4_;
        auVar78._8_4_ = fVar61 * auVar129._8_4_;
        fVar147 = auVar65._12_4_;
        auVar78._12_4_ = fVar147 * auVar129._12_4_;
        auVar156._0_4_ = fVar91 * auVar248._0_4_;
        auVar156._4_4_ = fVar92 * auVar248._4_4_;
        auVar156._8_4_ = fVar61 * auVar248._8_4_;
        auVar156._12_4_ = fVar147 * auVar248._12_4_;
        auVar64 = vfmadd231ps_fma(auVar78,auVar269,auVar95);
        auVar239 = vfmadd231ps_fma(auVar156,auVar269,local_1f8._0_16_);
        auVar248 = vshufps_avx(auVar64,auVar64,0xe8);
        auVar65 = vshufps_avx(auVar239,auVar239,0xe8);
        auVar129 = vcmpps_avx(auVar248,auVar65,1);
        uVar55 = vextractps_avx(auVar129,0);
        auVar63 = auVar239;
        if ((uVar55 & 1) == 0) {
          auVar63 = auVar64;
        }
        local_3a8._0_16_ = auVar10;
        auVar125._0_4_ = fVar122 * auVar87._16_4_ * 3.0;
        auVar125._4_4_ = fVar122 * fVar222;
        auVar125._8_4_ = fVar122 * auVar87._24_4_ * 3.0;
        auVar125._12_4_ = fVar122 * auVar145._28_4_;
        auVar62 = vsubps_avx((undefined1  [16])0x0,auVar125);
        auVar126 = vshufps_avx(auVar62,auVar62,0xb1);
        auVar123 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar187._0_4_ = fVar91 * auVar126._0_4_;
        auVar187._4_4_ = fVar92 * auVar126._4_4_;
        auVar187._8_4_ = fVar61 * auVar126._8_4_;
        auVar187._12_4_ = fVar147 * auVar126._12_4_;
        auVar204._0_4_ = auVar123._0_4_ * fVar91;
        auVar204._4_4_ = auVar123._4_4_ * fVar92;
        auVar204._8_4_ = auVar123._8_4_ * fVar61;
        auVar204._12_4_ = auVar123._12_4_ * fVar147;
        auVar94 = vfmadd231ps_fma(auVar187,auVar269,auVar62);
        auVar135 = vfmadd231ps_fma(auVar204,(undefined1  [16])0x0,auVar269);
        auVar123 = vshufps_avx(auVar94,auVar94,0xe8);
        auVar136 = vshufps_avx(auVar135,auVar135,0xe8);
        auVar145 = ZEXT1664(auVar136);
        auVar126 = vcmpps_avx(auVar123,auVar136,1);
        uVar55 = vextractps_avx(auVar126,0);
        auVar148 = auVar135;
        if ((uVar55 & 1) == 0) {
          auVar148 = auVar94;
        }
        auVar63 = vmaxss_avx(auVar148,auVar63);
        auVar248 = vminps_avx(auVar248,auVar65);
        auVar65 = vminps_avx(auVar123,auVar136);
        auVar65 = vminps_avx(auVar248,auVar65);
        auVar129 = vshufps_avx(auVar129,auVar129,0x55);
        auVar129 = vblendps_avx(auVar129,auVar126,2);
        auVar126 = vpslld_avx(auVar129,0x1f);
        auVar129 = vshufpd_avx(auVar239,auVar239,1);
        auVar129 = vinsertps_avx(auVar129,auVar135,0x9c);
        auVar248 = vshufpd_avx(auVar64,auVar64,1);
        auVar248 = vinsertps_avx(auVar248,auVar94,0x9c);
        auVar129 = vblendvps_avx(auVar248,auVar129,auVar126);
        auVar248 = vmovshdup_avx(auVar129);
        auVar129 = vmaxss_avx(auVar248,auVar129);
        fVar61 = auVar65._0_4_;
        auVar248 = vmovshdup_avx(auVar65);
        fVar92 = auVar129._0_4_;
        fVar122 = auVar248._0_4_;
        fVar91 = auVar63._0_4_;
        if (((fVar61 < 0.0001) && (-0.0001 < fVar92)) || (fVar122 < 0.0001 && -0.0001 < fVar92)) {
LAB_016221c5:
          auVar64 = vcmpps_avx(auVar65,_DAT_01f7aa10,1);
          auVar239 = SUB6416(ZEXT864(0),0) << 0x20;
          auVar248 = vcmpss_avx(auVar63,ZEXT816(0) << 0x20,1);
          auVar100._8_4_ = 0x3f800000;
          auVar100._0_8_ = 0x3f8000003f800000;
          auVar100._12_4_ = 0x3f800000;
          auVar114._8_4_ = 0xbf800000;
          auVar114._0_8_ = 0xbf800000bf800000;
          auVar114._12_4_ = 0xbf800000;
          auVar248 = vblendvps_avx(auVar100,auVar114,auVar248);
          auVar64 = vblendvps_avx(auVar100,auVar114,auVar64);
          fVar222 = auVar64._0_4_;
          fVar147 = auVar248._0_4_;
          auVar248 = SUB6416(ZEXT864(0),0) << 0x20;
          if ((fVar222 == fVar147) && (!NAN(fVar222) && !NAN(fVar147))) {
            auVar248 = SUB6416(ZEXT464(0x7f800000),0);
          }
          if ((fVar222 == fVar147) && (!NAN(fVar222) && !NAN(fVar147))) {
            auVar239 = SUB6416(ZEXT464(0xff800000),0);
          }
          auVar64 = vmovshdup_avx(auVar64);
          fVar183 = auVar64._0_4_;
          if ((fVar222 != fVar183) || (NAN(fVar222) || NAN(fVar183))) {
            if ((fVar122 != fVar61) || (NAN(fVar122) || NAN(fVar61))) {
              auVar127._0_8_ = auVar65._0_8_ ^ 0x8000000080000000;
              auVar127._8_4_ = auVar65._8_4_ ^ 0x80000000;
              auVar127._12_4_ = auVar65._12_4_ ^ 0x80000000;
              auVar128._0_4_ = -fVar61 / (fVar122 - fVar61);
              auVar128._4_12_ = auVar127._4_12_;
              auVar65 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar128._0_4_)),auVar128,ZEXT416(0));
              auVar64 = auVar65;
            }
            else {
              auVar65 = ZEXT816(0) << 0x20;
              if ((fVar61 != 0.0) || (auVar64 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar61))) {
                auVar65 = SUB6416(ZEXT464(0x7f800000),0);
                auVar64 = SUB6416(ZEXT464(0xff800000),0);
              }
            }
            auVar248 = vminss_avx(auVar248,auVar65);
            auVar239 = vmaxss_avx(auVar64,auVar239);
          }
          auVar129 = vcmpss_avx(auVar129,ZEXT416(0),1);
          auVar101._8_4_ = 0x3f800000;
          auVar101._0_8_ = 0x3f8000003f800000;
          auVar101._12_4_ = 0x3f800000;
          auVar115._8_4_ = 0xbf800000;
          auVar115._0_8_ = 0xbf800000bf800000;
          auVar115._12_4_ = 0xbf800000;
          auVar129 = vblendvps_avx(auVar101,auVar115,auVar129);
          fVar122 = auVar129._0_4_;
          if ((fVar147 != fVar122) || (NAN(fVar147) || NAN(fVar122))) {
            if ((fVar92 != fVar91) || (NAN(fVar92) || NAN(fVar91))) {
              auVar79._0_8_ = auVar63._0_8_ ^ 0x8000000080000000;
              auVar79._8_4_ = auVar63._8_4_ ^ 0x80000000;
              auVar79._12_4_ = auVar63._12_4_ ^ 0x80000000;
              auVar130._0_4_ = -fVar91 / (fVar92 - fVar91);
              auVar130._4_12_ = auVar79._4_12_;
              auVar129 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar130._0_4_)),auVar130,ZEXT416(0));
              auVar65 = auVar129;
            }
            else {
              auVar129 = SUB6416(ZEXT464(0x3f800000),0);
              if ((fVar91 != 0.0) || (auVar65 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar91))) {
                auVar129 = SUB6416(ZEXT464(0xff800000),0);
                auVar65 = SUB6416(ZEXT464(0x7f800000),0);
              }
            }
            auVar248 = vminss_avx(auVar248,auVar65);
            auVar239 = vmaxss_avx(auVar129,auVar239);
          }
          if ((fVar183 != fVar122) || (NAN(fVar183) || NAN(fVar122))) {
            auVar248 = vminss_avx(auVar248,SUB6416(ZEXT464(0x3f800000),0));
            auVar239 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar239);
          }
          auVar129 = vmaxss_avx(ZEXT816(0) << 0x40,auVar248);
          auVar248 = vminss_avx(auVar239,SUB6416(ZEXT464(0x3f800000),0));
          if (auVar129._0_4_ <= auVar248._0_4_) {
            auVar129 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar129._0_4_ + -0.1)));
            auVar248 = vminss_avx(ZEXT416((uint)(auVar248._0_4_ + 0.1)),
                                  SUB6416(ZEXT464(0x3f800000),0));
            auVar141._0_8_ = auVar95._0_8_;
            auVar141._8_8_ = auVar141._0_8_;
            auVar213._8_8_ = local_1f8._0_8_;
            auVar213._0_8_ = local_1f8._0_8_;
            auVar227._8_8_ = auVar62._0_8_;
            auVar227._0_8_ = auVar62._0_8_;
            auVar65 = vshufpd_avx(local_1f8._0_16_,local_1f8._0_16_,3);
            auVar64 = vshufpd_avx(auVar62,auVar62,3);
            auVar239 = vshufps_avx(auVar129,auVar248,0);
            auVar80._8_4_ = 0x3f800000;
            auVar80._0_8_ = 0x3f8000003f800000;
            auVar80._12_4_ = 0x3f800000;
            auVar95 = vsubps_avx(auVar80,auVar239);
            local_2e8._0_4_ = auVar11._0_4_;
            local_2e8._4_4_ = auVar11._4_4_;
            fStack_2e0 = auVar11._8_4_;
            fStack_2dc = auVar11._12_4_;
            fVar122 = auVar239._0_4_;
            auVar81._0_4_ = fVar122 * (float)local_2e8._0_4_;
            fVar91 = auVar239._4_4_;
            auVar81._4_4_ = fVar91 * (float)local_2e8._4_4_;
            fVar92 = auVar239._8_4_;
            auVar81._8_4_ = fVar92 * fStack_2e0;
            fVar61 = auVar239._12_4_;
            auVar81._12_4_ = fVar61 * fStack_2dc;
            auVar179._0_4_ = fVar122 * auVar65._0_4_;
            auVar179._4_4_ = fVar91 * auVar65._4_4_;
            auVar179._8_4_ = fVar92 * auVar65._8_4_;
            auVar179._12_4_ = fVar61 * auVar65._12_4_;
            auVar188._0_4_ = fVar122 * auVar64._0_4_;
            auVar188._4_4_ = fVar91 * auVar64._4_4_;
            auVar188._8_4_ = fVar92 * auVar64._8_4_;
            auVar188._12_4_ = fVar61 * auVar64._12_4_;
            local_338._0_4_ = auVar12._0_4_;
            local_338._4_4_ = auVar12._4_4_;
            fStack_330 = auVar12._8_4_;
            fStack_32c = auVar12._12_4_;
            auVar205._0_4_ = fVar122 * (float)local_338._0_4_;
            auVar205._4_4_ = fVar91 * (float)local_338._4_4_;
            auVar205._8_4_ = fVar92 * fStack_330;
            auVar205._12_4_ = fVar61 * fStack_32c;
            auVar65 = vfmadd231ps_fma(auVar81,auVar95,auVar141);
            auVar64 = vfmadd231ps_fma(auVar179,auVar95,auVar213);
            auVar239 = vfmadd231ps_fma(auVar188,auVar95,auVar227);
            auVar95 = vfmadd231ps_fma(auVar205,auVar95,ZEXT816(0));
            auVar11 = vmovshdup_avx(auVar247);
            auVar62 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * auVar129._0_4_)),auVar247,
                                      ZEXT416((uint)(1.0 - auVar129._0_4_)));
            auVar94 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * auVar248._0_4_)),auVar247,
                                      ZEXT416((uint)(1.0 - auVar248._0_4_)));
            fVar122 = 1.0 / fVar59;
            auVar129 = vsubps_avx(auVar64,auVar65);
            auVar214._0_4_ = auVar129._0_4_ * 3.0;
            auVar214._4_4_ = auVar129._4_4_ * 3.0;
            auVar214._8_4_ = auVar129._8_4_ * 3.0;
            auVar214._12_4_ = auVar129._12_4_ * 3.0;
            auVar129 = vsubps_avx(auVar239,auVar64);
            auVar228._0_4_ = auVar129._0_4_ * 3.0;
            auVar228._4_4_ = auVar129._4_4_ * 3.0;
            auVar228._8_4_ = auVar129._8_4_ * 3.0;
            auVar228._12_4_ = auVar129._12_4_ * 3.0;
            auVar129 = vsubps_avx(auVar95,auVar239);
            auVar240._0_4_ = auVar129._0_4_ * 3.0;
            auVar240._4_4_ = auVar129._4_4_ * 3.0;
            auVar240._8_4_ = auVar129._8_4_ * 3.0;
            auVar240._12_4_ = auVar129._12_4_ * 3.0;
            auVar11 = vminps_avx(auVar228,auVar240);
            auVar129 = vmaxps_avx(auVar228,auVar240);
            auVar11 = vminps_avx(auVar214,auVar11);
            auVar129 = vmaxps_avx(auVar214,auVar129);
            auVar12 = vshufpd_avx(auVar11,auVar11,3);
            auVar248 = vshufpd_avx(auVar129,auVar129,3);
            auVar11 = vminps_avx(auVar11,auVar12);
            auVar129 = vmaxps_avx(auVar129,auVar248);
            auVar229._0_4_ = auVar11._0_4_ * fVar122;
            auVar229._4_4_ = auVar11._4_4_ * fVar122;
            auVar229._8_4_ = auVar11._8_4_ * fVar122;
            auVar229._12_4_ = auVar11._12_4_ * fVar122;
            auVar215._0_4_ = auVar129._0_4_ * fVar122;
            auVar215._4_4_ = auVar129._4_4_ * fVar122;
            auVar215._8_4_ = auVar129._8_4_ * fVar122;
            auVar215._12_4_ = auVar129._12_4_ * fVar122;
            fVar122 = 1.0 / (auVar94._0_4_ - auVar62._0_4_);
            auVar129 = vshufpd_avx(auVar65,auVar65,3);
            auVar11 = vshufpd_avx(auVar64,auVar64,3);
            auVar12 = vshufpd_avx(auVar239,auVar239,3);
            auVar248 = vshufpd_avx(auVar95,auVar95,3);
            auVar129 = vsubps_avx(auVar129,auVar65);
            auVar65 = vsubps_avx(auVar11,auVar64);
            auVar64 = vsubps_avx(auVar12,auVar239);
            auVar248 = vsubps_avx(auVar248,auVar95);
            auVar11 = vminps_avx(auVar129,auVar65);
            auVar129 = vmaxps_avx(auVar129,auVar65);
            auVar12 = vminps_avx(auVar64,auVar248);
            auVar12 = vminps_avx(auVar11,auVar12);
            auVar11 = vmaxps_avx(auVar64,auVar248);
            auVar129 = vmaxps_avx(auVar129,auVar11);
            auVar260._0_4_ = fVar122 * auVar12._0_4_;
            auVar260._4_4_ = fVar122 * auVar12._4_4_;
            auVar260._8_4_ = fVar122 * auVar12._8_4_;
            auVar260._12_4_ = fVar122 * auVar12._12_4_;
            auVar249._0_4_ = fVar122 * auVar129._0_4_;
            auVar249._4_4_ = fVar122 * auVar129._4_4_;
            auVar249._8_4_ = fVar122 * auVar129._8_4_;
            auVar249._12_4_ = fVar122 * auVar129._12_4_;
            auVar248 = vinsertps_avx(auVar13,auVar62,0x10);
            auVar65 = vinsertps_avx(auVar10,auVar94,0x10);
            auVar241._0_4_ = (auVar248._0_4_ + auVar65._0_4_) * 0.5;
            auVar241._4_4_ = (auVar248._4_4_ + auVar65._4_4_) * 0.5;
            auVar241._8_4_ = (auVar248._8_4_ + auVar65._8_4_) * 0.5;
            auVar241._12_4_ = (auVar248._12_4_ + auVar65._12_4_) * 0.5;
            auVar82._4_4_ = auVar241._0_4_;
            auVar82._0_4_ = auVar241._0_4_;
            auVar82._8_4_ = auVar241._0_4_;
            auVar82._12_4_ = auVar241._0_4_;
            auVar129 = vfmadd213ps_fma(local_208,auVar82,local_478);
            auVar11 = vfmadd213ps_fma(local_218,auVar82,local_508);
            auVar12 = vfmadd213ps_fma(local_228,auVar82,local_468);
            auVar10 = vsubps_avx(auVar11,auVar129);
            auVar129 = vfmadd213ps_fma(auVar10,auVar82,auVar129);
            auVar10 = vsubps_avx(auVar12,auVar11);
            auVar10 = vfmadd213ps_fma(auVar10,auVar82,auVar11);
            auVar10 = vsubps_avx(auVar10,auVar129);
            auVar129 = vfmadd231ps_fma(auVar129,auVar10,auVar82);
            auVar83._0_8_ = CONCAT44(auVar10._4_4_ * 3.0,auVar10._0_4_ * 3.0);
            auVar83._8_4_ = auVar10._8_4_ * 3.0;
            auVar83._12_4_ = auVar10._12_4_ * 3.0;
            auVar270._8_8_ = auVar129._0_8_;
            auVar270._0_8_ = auVar129._0_8_;
            auVar10 = vshufpd_avx(auVar129,auVar129,3);
            auVar129 = vshufps_avx(auVar241,auVar241,0x55);
            auVar239 = vsubps_avx(auVar10,auVar270);
            auVar63 = vfmadd231ps_fma(auVar270,auVar129,auVar239);
            auVar276._8_8_ = auVar83._0_8_;
            auVar276._0_8_ = auVar83._0_8_;
            auVar10 = vshufpd_avx(auVar83,auVar83,3);
            auVar10 = vsubps_avx(auVar10,auVar276);
            auVar95 = vfmadd213ps_fma(auVar10,auVar129,auVar276);
            auVar129 = vmovshdup_avx(auVar95);
            auVar277._0_8_ = auVar129._0_8_ ^ 0x8000000080000000;
            auVar277._8_4_ = auVar129._8_4_ ^ 0x80000000;
            auVar277._12_4_ = auVar129._12_4_ ^ 0x80000000;
            auVar11 = vmovshdup_avx(auVar239);
            auVar10 = vunpcklps_avx(auVar11,auVar277);
            auVar12 = vshufps_avx(auVar10,auVar277,4);
            auVar64 = vshufps_avx(auVar241,auVar241,0x54);
            auVar131._0_8_ = auVar239._0_8_ ^ 0x8000000080000000;
            auVar131._8_4_ = auVar239._8_4_ ^ 0x80000000;
            auVar131._12_4_ = auVar239._12_4_ ^ 0x80000000;
            auVar10 = vmovlhps_avx(auVar131,auVar95);
            auVar10 = vshufps_avx(auVar10,auVar95,8);
            auVar129 = vfmsub231ss_fma(ZEXT416((uint)(auVar239._0_4_ * auVar129._0_4_)),auVar11,
                                       auVar95);
            uVar60 = auVar129._0_4_;
            auVar84._4_4_ = uVar60;
            auVar84._0_4_ = uVar60;
            auVar84._8_4_ = uVar60;
            auVar84._12_4_ = uVar60;
            auVar129 = vdivps_avx(auVar12,auVar84);
            auVar11 = vdivps_avx(auVar10,auVar84);
            fVar92 = auVar63._0_4_;
            fVar122 = auVar129._0_4_;
            auVar10 = vshufps_avx(auVar63,auVar63,0x55);
            fVar91 = auVar11._0_4_;
            auVar85._0_4_ = fVar92 * fVar122 + auVar10._0_4_ * fVar91;
            auVar85._4_4_ = fVar92 * auVar129._4_4_ + auVar10._4_4_ * auVar11._4_4_;
            auVar85._8_4_ = fVar92 * auVar129._8_4_ + auVar10._8_4_ * auVar11._8_4_;
            auVar85._12_4_ = fVar92 * auVar129._12_4_ + auVar10._12_4_ * auVar11._12_4_;
            auVar136 = vsubps_avx(auVar64,auVar85);
            auVar64 = vmovshdup_avx(auVar129);
            auVar10 = vinsertps_avx(auVar229,auVar260,0x1c);
            auVar157._0_4_ = auVar64._0_4_ * auVar10._0_4_;
            auVar157._4_4_ = auVar64._4_4_ * auVar10._4_4_;
            auVar157._8_4_ = auVar64._8_4_ * auVar10._8_4_;
            auVar157._12_4_ = auVar64._12_4_ * auVar10._12_4_;
            auVar12 = vinsertps_avx(auVar215,auVar249,0x1c);
            auVar102._0_4_ = auVar12._0_4_ * auVar64._0_4_;
            auVar102._4_4_ = auVar12._4_4_ * auVar64._4_4_;
            auVar102._8_4_ = auVar12._8_4_ * auVar64._8_4_;
            auVar102._12_4_ = auVar12._12_4_ * auVar64._12_4_;
            auVar63 = vminps_avx(auVar157,auVar102);
            auVar95 = vmaxps_avx(auVar102,auVar157);
            auVar64 = vinsertps_avx(auVar260,auVar229,0x4c);
            auVar126 = vmovshdup_avx(auVar11);
            auVar239 = vinsertps_avx(auVar249,auVar215,0x4c);
            auVar250._0_4_ = auVar126._0_4_ * auVar64._0_4_;
            auVar250._4_4_ = auVar126._4_4_ * auVar64._4_4_;
            auVar250._8_4_ = auVar126._8_4_ * auVar64._8_4_;
            auVar250._12_4_ = auVar126._12_4_ * auVar64._12_4_;
            auVar230._0_4_ = auVar126._0_4_ * auVar239._0_4_;
            auVar230._4_4_ = auVar126._4_4_ * auVar239._4_4_;
            auVar230._8_4_ = auVar126._8_4_ * auVar239._8_4_;
            auVar230._12_4_ = auVar126._12_4_ * auVar239._12_4_;
            auVar126 = vminps_avx(auVar250,auVar230);
            auVar261._0_4_ = auVar63._0_4_ + auVar126._0_4_;
            auVar261._4_4_ = auVar63._4_4_ + auVar126._4_4_;
            auVar261._8_4_ = auVar63._8_4_ + auVar126._8_4_;
            auVar261._12_4_ = auVar63._12_4_ + auVar126._12_4_;
            auVar63 = vmaxps_avx(auVar230,auVar250);
            auVar103._0_4_ = auVar63._0_4_ + auVar95._0_4_;
            auVar103._4_4_ = auVar63._4_4_ + auVar95._4_4_;
            auVar103._8_4_ = auVar63._8_4_ + auVar95._8_4_;
            auVar103._12_4_ = auVar63._12_4_ + auVar95._12_4_;
            auVar231._8_8_ = 0x3f80000000000000;
            auVar231._0_8_ = 0x3f80000000000000;
            auVar95 = vsubps_avx(auVar231,auVar103);
            auVar63 = vsubps_avx(auVar231,auVar261);
            auVar126 = vsubps_avx(auVar248,auVar241);
            auVar123 = vsubps_avx(auVar65,auVar241);
            auVar116._0_4_ = fVar122 * auVar10._0_4_;
            auVar116._4_4_ = fVar122 * auVar10._4_4_;
            auVar116._8_4_ = fVar122 * auVar10._8_4_;
            auVar116._12_4_ = fVar122 * auVar10._12_4_;
            auVar262._0_4_ = fVar122 * auVar12._0_4_;
            auVar262._4_4_ = fVar122 * auVar12._4_4_;
            auVar262._8_4_ = fVar122 * auVar12._8_4_;
            auVar262._12_4_ = fVar122 * auVar12._12_4_;
            auVar12 = vminps_avx(auVar116,auVar262);
            auVar10 = vmaxps_avx(auVar262,auVar116);
            auVar158._0_4_ = fVar91 * auVar64._0_4_;
            auVar158._4_4_ = fVar91 * auVar64._4_4_;
            auVar158._8_4_ = fVar91 * auVar64._8_4_;
            auVar158._12_4_ = fVar91 * auVar64._12_4_;
            auVar216._0_4_ = fVar91 * auVar239._0_4_;
            auVar216._4_4_ = fVar91 * auVar239._4_4_;
            auVar216._8_4_ = fVar91 * auVar239._8_4_;
            auVar216._12_4_ = fVar91 * auVar239._12_4_;
            auVar64 = vminps_avx(auVar158,auVar216);
            auVar263._0_4_ = auVar12._0_4_ + auVar64._0_4_;
            auVar263._4_4_ = auVar12._4_4_ + auVar64._4_4_;
            auVar263._8_4_ = auVar12._8_4_ + auVar64._8_4_;
            auVar263._12_4_ = auVar12._12_4_ + auVar64._12_4_;
            fVar183 = auVar126._0_4_;
            auVar271._0_4_ = fVar183 * auVar95._0_4_;
            fVar196 = auVar126._4_4_;
            auVar271._4_4_ = fVar196 * auVar95._4_4_;
            fVar197 = auVar126._8_4_;
            auVar271._8_4_ = fVar197 * auVar95._8_4_;
            fVar198 = auVar126._12_4_;
            auVar271._12_4_ = fVar198 * auVar95._12_4_;
            auVar12 = vmaxps_avx(auVar216,auVar158);
            auVar217._0_4_ = fVar183 * auVar63._0_4_;
            auVar217._4_4_ = fVar196 * auVar63._4_4_;
            auVar217._8_4_ = fVar197 * auVar63._8_4_;
            auVar217._12_4_ = fVar198 * auVar63._12_4_;
            fVar92 = auVar123._0_4_;
            auVar104._0_4_ = fVar92 * auVar95._0_4_;
            fVar61 = auVar123._4_4_;
            auVar104._4_4_ = fVar61 * auVar95._4_4_;
            fVar147 = auVar123._8_4_;
            auVar104._8_4_ = fVar147 * auVar95._8_4_;
            fVar222 = auVar123._12_4_;
            auVar104._12_4_ = fVar222 * auVar95._12_4_;
            auVar232._0_4_ = fVar92 * auVar63._0_4_;
            auVar232._4_4_ = fVar61 * auVar63._4_4_;
            auVar232._8_4_ = fVar147 * auVar63._8_4_;
            auVar232._12_4_ = fVar222 * auVar63._12_4_;
            auVar117._0_4_ = auVar10._0_4_ + auVar12._0_4_;
            auVar117._4_4_ = auVar10._4_4_ + auVar12._4_4_;
            auVar117._8_4_ = auVar10._8_4_ + auVar12._8_4_;
            auVar117._12_4_ = auVar10._12_4_ + auVar12._12_4_;
            auVar159._8_8_ = 0x3f800000;
            auVar159._0_8_ = 0x3f800000;
            auVar10 = vsubps_avx(auVar159,auVar117);
            auVar12 = vsubps_avx(auVar159,auVar263);
            auVar264._0_4_ = fVar183 * auVar10._0_4_;
            auVar264._4_4_ = fVar196 * auVar10._4_4_;
            auVar264._8_4_ = fVar197 * auVar10._8_4_;
            auVar264._12_4_ = fVar198 * auVar10._12_4_;
            auVar251._0_4_ = fVar183 * auVar12._0_4_;
            auVar251._4_4_ = fVar196 * auVar12._4_4_;
            auVar251._8_4_ = fVar197 * auVar12._8_4_;
            auVar251._12_4_ = fVar198 * auVar12._12_4_;
            auVar118._0_4_ = fVar92 * auVar10._0_4_;
            auVar118._4_4_ = fVar61 * auVar10._4_4_;
            auVar118._8_4_ = fVar147 * auVar10._8_4_;
            auVar118._12_4_ = fVar222 * auVar10._12_4_;
            auVar160._0_4_ = fVar92 * auVar12._0_4_;
            auVar160._4_4_ = fVar61 * auVar12._4_4_;
            auVar160._8_4_ = fVar147 * auVar12._8_4_;
            auVar160._12_4_ = fVar222 * auVar12._12_4_;
            auVar10 = vminps_avx(auVar264,auVar251);
            auVar12 = vminps_avx(auVar118,auVar160);
            auVar10 = vminps_avx(auVar10,auVar12);
            auVar12 = vmaxps_avx(auVar251,auVar264);
            auVar64 = vmaxps_avx(auVar160,auVar118);
            auVar239 = vminps_avx(auVar271,auVar217);
            auVar95 = vminps_avx(auVar104,auVar232);
            auVar239 = vminps_avx(auVar239,auVar95);
            auVar10 = vhaddps_avx(auVar10,auVar239);
            auVar12 = vmaxps_avx(auVar64,auVar12);
            auVar64 = vmaxps_avx(auVar217,auVar271);
            auVar239 = vmaxps_avx(auVar232,auVar104);
            auVar64 = vmaxps_avx(auVar239,auVar64);
            auVar12 = vhaddps_avx(auVar12,auVar64);
            auVar10 = vshufps_avx(auVar10,auVar10,0xe8);
            auVar12 = vshufps_avx(auVar12,auVar12,0xe8);
            auVar233._0_4_ = auVar136._0_4_ + auVar10._0_4_;
            auVar233._4_4_ = auVar136._4_4_ + auVar10._4_4_;
            auVar233._8_4_ = auVar136._8_4_ + auVar10._8_4_;
            auVar233._12_4_ = auVar136._12_4_ + auVar10._12_4_;
            auVar218._0_4_ = auVar136._0_4_ + auVar12._0_4_;
            auVar218._4_4_ = auVar136._4_4_ + auVar12._4_4_;
            auVar218._8_4_ = auVar136._8_4_ + auVar12._8_4_;
            auVar218._12_4_ = auVar136._12_4_ + auVar12._12_4_;
            auVar145 = ZEXT1664(auVar218);
            auVar10 = vmaxps_avx(auVar248,auVar233);
            auVar12 = vminps_avx(auVar218,auVar65);
            auVar10 = vcmpps_avx(auVar12,auVar10,1);
            auVar10 = vshufps_avx(auVar10,auVar10,0x50);
            if ((auVar10 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                -1 < auVar10[0xf]) {
              bVar53 = 0;
              if ((auVar194._0_4_ < auVar233._0_4_) && (bVar53 = 0, auVar218._0_4_ < auVar65._0_4_))
              {
                auVar12 = vmovshdup_avx(auVar233);
                auVar10 = vcmpps_avx(auVar218,auVar65,1);
                bVar53 = auVar10[4] & auVar62._0_4_ < auVar12._0_4_;
              }
              if (((3 < uVar56 || fVar59 < 0.001) | bVar53) != 1) goto LAB_01622d4b;
              lVar52 = 200;
              do {
                fVar61 = auVar136._0_4_;
                fVar92 = 1.0 - fVar61;
                fVar59 = fVar92 * fVar92 * fVar92;
                fVar90 = fVar61 * 3.0 * fVar92 * fVar92;
                fVar92 = fVar92 * fVar61 * fVar61 * 3.0;
                auVar142._4_4_ = fVar59;
                auVar142._0_4_ = fVar59;
                auVar142._8_4_ = fVar59;
                auVar142._12_4_ = fVar59;
                auVar119._4_4_ = fVar90;
                auVar119._0_4_ = fVar90;
                auVar119._8_4_ = fVar90;
                auVar119._12_4_ = fVar90;
                auVar105._4_4_ = fVar92;
                auVar105._0_4_ = fVar92;
                auVar105._8_4_ = fVar92;
                auVar105._12_4_ = fVar92;
                fVar61 = fVar61 * fVar61 * fVar61;
                auVar161._0_4_ = fVar61 * (float)local_378._0_4_;
                auVar161._4_4_ = fVar61 * (float)local_378._4_4_;
                auVar161._8_4_ = fVar61 * fStack_370;
                auVar161._12_4_ = fVar61 * fStack_36c;
                auVar13 = vfmadd231ps_fma(auVar161,auVar105,local_468);
                auVar13 = vfmadd231ps_fma(auVar13,auVar119,local_508);
                auVar13 = vfmadd231ps_fma(auVar13,local_478,auVar142);
                auVar106._8_8_ = auVar13._0_8_;
                auVar106._0_8_ = auVar13._0_8_;
                auVar13 = vshufpd_avx(auVar13,auVar13,3);
                auVar10 = vshufps_avx(auVar136,auVar136,0x55);
                auVar13 = vsubps_avx(auVar13,auVar106);
                auVar10 = vfmadd213ps_fma(auVar13,auVar10,auVar106);
                fVar59 = auVar10._0_4_;
                auVar13 = vshufps_avx(auVar10,auVar10,0x55);
                auVar107._0_4_ = fVar122 * fVar59 + fVar91 * auVar13._0_4_;
                auVar107._4_4_ = auVar129._4_4_ * fVar59 + auVar11._4_4_ * auVar13._4_4_;
                auVar107._8_4_ = auVar129._8_4_ * fVar59 + auVar11._8_4_ * auVar13._8_4_;
                auVar107._12_4_ = auVar129._12_4_ * fVar59 + auVar11._12_4_ * auVar13._12_4_;
                auVar136 = vsubps_avx(auVar136,auVar107);
                auVar13 = vandps_avx(local_2f8,auVar10);
                auVar10 = vshufps_avx(auVar13,auVar13,0xf5);
                auVar13 = vmaxss_avx(auVar10,auVar13);
                if (auVar13._0_4_ < (float)local_388._0_4_) {
                  fVar59 = auVar136._0_4_;
                  if ((0.0 <= fVar59) && (fVar59 <= 1.0)) {
                    auVar13 = vmovshdup_avx(auVar136);
                    fVar90 = auVar13._0_4_;
                    if ((0.0 <= fVar90) && (fVar90 <= 1.0)) {
                      auVar13 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                              ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),
                                              0x1c);
                      auVar64 = vinsertps_avx(auVar13,ZEXT416((uint)(pre->ray_space).vz.field_0.m128
                                                                    [2]),0x28);
                      aVar2 = (ray->super_RayK<1>).org.field_0;
                      auVar13 = vsubps_avx(local_3f8,(undefined1  [16])aVar2);
                      auVar13 = vdpps_avx(auVar13,auVar64,0x7f);
                      auVar10 = vsubps_avx(local_428,(undefined1  [16])aVar2);
                      auVar10 = vdpps_avx(auVar10,auVar64,0x7f);
                      auVar129 = vsubps_avx(local_438,(undefined1  [16])aVar2);
                      auVar129 = vdpps_avx(auVar129,auVar64,0x7f);
                      auVar11 = vsubps_avx(local_418,(undefined1  [16])aVar2);
                      auVar11 = vdpps_avx(auVar11,auVar64,0x7f);
                      auVar12 = vsubps_avx(_local_408,(undefined1  [16])aVar2);
                      auVar12 = vdpps_avx(auVar12,auVar64,0x7f);
                      auVar248 = vsubps_avx(_local_448,(undefined1  [16])aVar2);
                      auVar248 = vdpps_avx(auVar248,auVar64,0x7f);
                      auVar65 = vsubps_avx(_local_458,(undefined1  [16])aVar2);
                      auVar65 = vdpps_avx(auVar65,auVar64,0x7f);
                      auVar45._4_4_ = fStack_484;
                      auVar45._0_4_ = local_488;
                      auVar45._8_4_ = fStack_480;
                      auVar45._12_4_ = fStack_47c;
                      auVar239 = vsubps_avx(auVar45,(undefined1  [16])aVar2);
                      auVar64 = vdpps_avx(auVar239,auVar64,0x7f);
                      fVar122 = 1.0 - fVar90;
                      auVar13 = vfmadd231ss_fma(ZEXT416((uint)(auVar12._0_4_ * fVar90)),
                                                ZEXT416((uint)fVar122),auVar13);
                      auVar10 = vfmadd231ss_fma(ZEXT416((uint)(auVar248._0_4_ * fVar90)),
                                                ZEXT416((uint)fVar122),auVar10);
                      auVar129 = vfmadd231ss_fma(ZEXT416((uint)(auVar65._0_4_ * fVar90)),
                                                 ZEXT416((uint)fVar122),auVar129);
                      auVar145 = ZEXT1664(auVar129);
                      auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar90 * auVar64._0_4_)),
                                                ZEXT416((uint)fVar122),auVar11);
                      fVar92 = 1.0 - fVar59;
                      fVar90 = fVar92 * fVar59 * fVar59 * 3.0;
                      fVar147 = fVar59 * fVar59 * fVar59;
                      auVar129 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * fVar147)),
                                                 ZEXT416((uint)fVar90),auVar129);
                      fVar122 = fVar59 * 3.0 * fVar92 * fVar92;
                      auVar10 = vfmadd231ss_fma(auVar129,ZEXT416((uint)fVar122),auVar10);
                      fVar91 = fVar92 * fVar92 * fVar92;
                      auVar13 = vfmadd231ss_fma(auVar10,ZEXT416((uint)fVar91),auVar13);
                      fVar61 = auVar13._0_4_;
                      if ((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar61) &&
                          (fVar222 = (ray->super_RayK<1>).tfar, fVar61 <= fVar222)) &&
                         (pGVar5 = (context->scene->geometries).items[uVar50].ptr,
                         (pGVar5->mask & (ray->super_RayK<1>).mask) != 0)) {
                        auVar13 = vshufps_avx(auVar136,auVar136,0x55);
                        auVar206._8_4_ = 0x3f800000;
                        auVar206._0_8_ = 0x3f8000003f800000;
                        auVar206._12_4_ = 0x3f800000;
                        auVar10 = vsubps_avx(auVar206,auVar13);
                        fVar183 = auVar13._0_4_;
                        auVar219._0_4_ = fVar183 * (float)local_408._0_4_;
                        fVar196 = auVar13._4_4_;
                        auVar219._4_4_ = fVar196 * (float)local_408._4_4_;
                        fVar197 = auVar13._8_4_;
                        auVar219._8_4_ = fVar197 * fStack_400;
                        fVar198 = auVar13._12_4_;
                        auVar219._12_4_ = fVar198 * fStack_3fc;
                        auVar234._0_4_ = fVar183 * (float)local_448._0_4_;
                        auVar234._4_4_ = fVar196 * (float)local_448._4_4_;
                        auVar234._8_4_ = fVar197 * fStack_440;
                        auVar234._12_4_ = fVar198 * fStack_43c;
                        auVar242._0_4_ = fVar183 * (float)local_458._0_4_;
                        auVar242._4_4_ = fVar196 * (float)local_458._4_4_;
                        auVar242._8_4_ = fVar197 * fStack_450;
                        auVar242._12_4_ = fVar198 * fStack_44c;
                        auVar189._0_4_ = fVar183 * local_488;
                        auVar189._4_4_ = fVar196 * fStack_484;
                        auVar189._8_4_ = fVar197 * fStack_480;
                        auVar189._12_4_ = fVar198 * fStack_47c;
                        auVar13 = vfmadd231ps_fma(auVar219,auVar10,local_3f8);
                        auVar129 = vfmadd231ps_fma(auVar234,auVar10,local_428);
                        auVar11 = vfmadd231ps_fma(auVar242,auVar10,local_438);
                        auVar12 = vfmadd231ps_fma(auVar189,auVar10,local_418);
                        auVar13 = vsubps_avx(auVar129,auVar13);
                        auVar10 = vsubps_avx(auVar11,auVar129);
                        auVar145 = ZEXT1664(auVar10);
                        auVar129 = vsubps_avx(auVar12,auVar11);
                        auVar243._0_4_ = fVar59 * auVar10._0_4_;
                        auVar243._4_4_ = fVar59 * auVar10._4_4_;
                        auVar243._8_4_ = fVar59 * auVar10._8_4_;
                        auVar243._12_4_ = fVar59 * auVar10._12_4_;
                        auVar180._4_4_ = fVar92;
                        auVar180._0_4_ = fVar92;
                        auVar180._8_4_ = fVar92;
                        auVar180._12_4_ = fVar92;
                        auVar13 = vfmadd231ps_fma(auVar243,auVar180,auVar13);
                        auVar190._0_4_ = fVar59 * auVar129._0_4_;
                        auVar190._4_4_ = fVar59 * auVar129._4_4_;
                        auVar190._8_4_ = fVar59 * auVar129._8_4_;
                        auVar190._12_4_ = fVar59 * auVar129._12_4_;
                        auVar129 = vfmadd231ps_fma(auVar190,auVar180,auVar10);
                        auVar191._0_4_ = fVar59 * auVar129._0_4_;
                        auVar191._4_4_ = fVar59 * auVar129._4_4_;
                        auVar191._8_4_ = fVar59 * auVar129._8_4_;
                        auVar191._12_4_ = fVar59 * auVar129._12_4_;
                        auVar129 = vfmadd231ps_fma(auVar191,auVar180,auVar13);
                        auVar162._0_4_ = fVar147 * (float)local_278._0_4_;
                        auVar162._4_4_ = fVar147 * (float)local_278._4_4_;
                        auVar162._8_4_ = fVar147 * fStack_270;
                        auVar162._12_4_ = fVar147 * fStack_26c;
                        auVar120._4_4_ = fVar90;
                        auVar120._0_4_ = fVar90;
                        auVar120._8_4_ = fVar90;
                        auVar120._12_4_ = fVar90;
                        auVar13 = vfmadd132ps_fma(auVar120,auVar162,local_268);
                        auVar143._4_4_ = fVar122;
                        auVar143._0_4_ = fVar122;
                        auVar143._8_4_ = fVar122;
                        auVar143._12_4_ = fVar122;
                        auVar13 = vfmadd132ps_fma(auVar143,auVar13,local_258);
                        auVar163._0_4_ = auVar129._0_4_ * 3.0;
                        auVar163._4_4_ = auVar129._4_4_ * 3.0;
                        auVar163._8_4_ = auVar129._8_4_ * 3.0;
                        auVar163._12_4_ = auVar129._12_4_ * 3.0;
                        auVar132._4_4_ = fVar91;
                        auVar132._0_4_ = fVar91;
                        auVar132._8_4_ = fVar91;
                        auVar132._12_4_ = fVar91;
                        auVar129 = vfmadd132ps_fma(auVar132,auVar13,local_248);
                        auVar13 = vshufps_avx(auVar163,auVar163,0xc9);
                        auVar121._0_4_ = auVar129._0_4_ * auVar13._0_4_;
                        auVar121._4_4_ = auVar129._4_4_ * auVar13._4_4_;
                        auVar121._8_4_ = auVar129._8_4_ * auVar13._8_4_;
                        auVar121._12_4_ = auVar129._12_4_ * auVar13._12_4_;
                        auVar13 = vshufps_avx(auVar129,auVar129,0xc9);
                        auVar13 = vfmsub231ps_fma(auVar121,auVar163,auVar13);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar61;
                          auVar10 = vshufps_avx(auVar13,auVar13,0xe9);
                          uVar93 = vmovlps_avx(auVar10);
                          *(undefined8 *)&(ray->Ng).field_0 = uVar93;
                          (ray->Ng).field_0.field_0.z = auVar13._0_4_;
                          uVar93 = vmovlps_avx(auVar136);
                          ray->u = (float)(int)uVar93;
                          ray->v = (float)(int)((ulong)uVar93 >> 0x20);
                          ray->primID = (uint)local_490;
                          ray->geomID = uVar50;
                          ray->instID[0] = context->user->instID[0];
                          ray->instPrimID[0] = context->user->instPrimID[0];
                        }
                        else {
                          local_4f8._0_4_ = fVar222;
                          auVar129 = vshufps_avx(auVar13,auVar13,0xe9);
                          local_2b8 = vmovlps_avx(auVar129);
                          local_2b0 = auVar13._0_4_;
                          local_2ac = vmovlps_avx(auVar136);
                          local_2a4 = (uint)local_490;
                          local_2a0 = uVar50;
                          local_29c = context->user->instID[0];
                          local_298 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar61;
                          local_50c = -1;
                          local_368.valid = &local_50c;
                          local_368.geometryUserPtr = pGVar5->userPtr;
                          local_368.context = context->user;
                          local_368.ray = (RTCRayN *)ray;
                          local_368.hit = (RTCHitN *)&local_2b8;
                          local_368.N = 1;
                          if (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01622bff:
                            p_Var6 = context->args->filter;
                            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar145 = ZEXT1664(auVar145._0_16_);
                              (*p_Var6)(&local_368);
                              if (*local_368.valid == 0) goto LAB_01622ca2;
                            }
                            (((Vec3f *)((long)local_368.ray + 0x30))->field_0).components[0] =
                                 *(float *)local_368.hit;
                            (((Vec3f *)((long)local_368.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_368.hit + 4);
                            (((Vec3f *)((long)local_368.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_368.hit + 8);
                            *(float *)((long)local_368.ray + 0x3c) = *(float *)(local_368.hit + 0xc)
                            ;
                            *(float *)((long)local_368.ray + 0x40) =
                                 *(float *)(local_368.hit + 0x10);
                            *(float *)((long)local_368.ray + 0x44) =
                                 *(float *)(local_368.hit + 0x14);
                            *(float *)((long)local_368.ray + 0x48) =
                                 *(float *)(local_368.hit + 0x18);
                            *(float *)((long)local_368.ray + 0x4c) =
                                 *(float *)(local_368.hit + 0x1c);
                            *(float *)((long)local_368.ray + 0x50) =
                                 *(float *)(local_368.hit + 0x20);
                          }
                          else {
                            auVar145 = ZEXT1664(auVar10);
                            (*pGVar5->intersectionFilterN)(&local_368);
                            if (*local_368.valid != 0) goto LAB_01622bff;
LAB_01622ca2:
                            (ray->super_RayK<1>).tfar = (float)local_4f8._0_4_;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar52 = lVar52 + -1;
              } while (lVar52 != 0);
            }
          }
        }
        else {
          auVar248 = vcmpps_avx(auVar248,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar64 = vcmpps_avx(auVar65,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar248 = vandps_avx(auVar64,auVar248);
          if (-0.0001 < fVar91 && (auVar248 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
          goto LAB_016221c5;
        }
        if (uVar56 == 0) break;
      } while( true );
    }
    fVar59 = (ray->super_RayK<1>).tfar;
    auVar86._4_4_ = fVar59;
    auVar86._0_4_ = fVar59;
    auVar86._8_4_ = fVar59;
    auVar86._12_4_ = fVar59;
    auVar13 = vcmpps_avx(local_288,auVar86,2);
    uVar50 = vmovmskps_avx(auVar13);
    uVar50 = (uint)uVar57 & uVar50;
    if (uVar50 == 0) {
      return;
    }
  } while( true );
LAB_01622d4b:
  auVar13 = vinsertps_avx(auVar13,ZEXT416((uint)fVar90),0x10);
  auVar266 = ZEXT1664(auVar13);
  auVar13 = vinsertps_avx(auVar62,ZEXT416((uint)auVar94._0_4_),0x10);
  auVar255 = ZEXT1664(auVar13);
  auVar209 = ZEXT1664(local_4a8);
  auVar165 = ZEXT1664(local_3b8);
  auVar195 = ZEXT1664(local_3c8);
  auVar221 = ZEXT1664(local_3d8);
  auVar145 = ZEXT1664(_local_3e8);
  auVar182 = ZEXT1664(local_4b8);
  auVar235 = ZEXT1664(local_4c8);
  auVar244 = ZEXT1664(local_4d8);
  goto LAB_0162190d;
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          
          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }